

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  uint uVar65;
  undefined4 uVar66;
  uint uVar67;
  undefined8 unaff_R13;
  bool bVar68;
  float fVar69;
  undefined8 uVar70;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar71 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar74 [16];
  undefined1 auVar87 [32];
  undefined1 auVar79 [16];
  undefined1 auVar89 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 extraout_var_00 [60];
  float fVar95;
  undefined8 extraout_XMM1_Qa;
  float fVar126;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar125;
  float fVar127;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar146;
  float fVar172;
  vint4 ai_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [28];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar211;
  float fVar212;
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar243 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar248 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar256 [16];
  undefined1 auVar261 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c44;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8e8;
  ulong local_8e0;
  undefined1 auStack_8d8 [24];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  uint local_740;
  uint uStack_73c;
  uint uStack_738;
  uint uStack_734;
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  uint local_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint uStack_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar124 [64];
  undefined1 auVar242 [16];
  undefined1 auVar257 [32];
  
  PVar3 = prim[1];
  uVar62 = (ulong)(byte)PVar3;
  fVar69 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar71._0_4_ = fVar69 * auVar7._0_4_;
  auVar71._4_4_ = fVar69 * auVar7._4_4_;
  auVar71._8_4_ = fVar69 * auVar7._8_4_;
  auVar71._12_4_ = fVar69 * auVar7._12_4_;
  auVar186._0_4_ = fVar69 * auVar8._0_4_;
  auVar186._4_4_ = fVar69 * auVar8._4_4_;
  auVar186._8_4_ = fVar69 * auVar8._8_4_;
  auVar186._12_4_ = fVar69 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xd + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x12 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x13 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x14 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar262._4_4_ = auVar186._0_4_;
  auVar262._0_4_ = auVar186._0_4_;
  auVar262._8_4_ = auVar186._0_4_;
  auVar262._12_4_ = auVar186._0_4_;
  auVar97 = vshufps_avx(auVar186,auVar186,0x55);
  auVar76 = vshufps_avx(auVar186,auVar186,0xaa);
  fVar69 = auVar76._0_4_;
  auVar237._0_4_ = fVar69 * auVar9._0_4_;
  fVar92 = auVar76._4_4_;
  auVar237._4_4_ = fVar92 * auVar9._4_4_;
  fVar93 = auVar76._8_4_;
  auVar237._8_4_ = fVar93 * auVar9._8_4_;
  fVar94 = auVar76._12_4_;
  auVar237._12_4_ = fVar94 * auVar9._12_4_;
  auVar231._0_4_ = auVar12._0_4_ * fVar69;
  auVar231._4_4_ = auVar12._4_4_ * fVar92;
  auVar231._8_4_ = auVar12._8_4_ * fVar93;
  auVar231._12_4_ = auVar12._12_4_ * fVar94;
  auVar217._0_4_ = auVar81._0_4_ * fVar69;
  auVar217._4_4_ = auVar81._4_4_ * fVar92;
  auVar217._8_4_ = auVar81._8_4_ * fVar93;
  auVar217._12_4_ = auVar81._12_4_ * fVar94;
  auVar76 = vfmadd231ps_fma(auVar237,auVar97,auVar8);
  auVar98 = vfmadd231ps_fma(auVar231,auVar97,auVar11);
  auVar97 = vfmadd231ps_fma(auVar217,auVar72,auVar97);
  auVar147 = vfmadd231ps_fma(auVar76,auVar262,auVar7);
  auVar98 = vfmadd231ps_fma(auVar98,auVar262,auVar10);
  auVar174 = vfmadd231ps_fma(auVar97,auVar73,auVar262);
  auVar263._4_4_ = auVar71._0_4_;
  auVar263._0_4_ = auVar71._0_4_;
  auVar263._8_4_ = auVar71._0_4_;
  auVar263._12_4_ = auVar71._0_4_;
  auVar97 = vshufps_avx(auVar71,auVar71,0x55);
  auVar76 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar69 = auVar76._0_4_;
  auVar187._0_4_ = fVar69 * auVar9._0_4_;
  fVar92 = auVar76._4_4_;
  auVar187._4_4_ = fVar92 * auVar9._4_4_;
  fVar93 = auVar76._8_4_;
  auVar187._8_4_ = fVar93 * auVar9._8_4_;
  fVar94 = auVar76._12_4_;
  auVar187._12_4_ = fVar94 * auVar9._12_4_;
  auVar96._0_4_ = auVar12._0_4_ * fVar69;
  auVar96._4_4_ = auVar12._4_4_ * fVar92;
  auVar96._8_4_ = auVar12._8_4_ * fVar93;
  auVar96._12_4_ = auVar12._12_4_ * fVar94;
  auVar76._0_4_ = auVar81._0_4_ * fVar69;
  auVar76._4_4_ = auVar81._4_4_ * fVar92;
  auVar76._8_4_ = auVar81._8_4_ * fVar93;
  auVar76._12_4_ = auVar81._12_4_ * fVar94;
  auVar8 = vfmadd231ps_fma(auVar187,auVar97,auVar8);
  auVar9 = vfmadd231ps_fma(auVar96,auVar97,auVar11);
  auVar11 = vfmadd231ps_fma(auVar76,auVar97,auVar72);
  auVar12 = vfmadd231ps_fma(auVar8,auVar263,auVar7);
  auVar72 = vfmadd231ps_fma(auVar9,auVar263,auVar10);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar81 = vfmadd231ps_fma(auVar11,auVar263,auVar73);
  auVar7 = vandps_avx(auVar147,auVar227);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar173,1);
  auVar8 = vblendvps_avx(auVar147,auVar173,auVar7);
  auVar7 = vandps_avx(auVar98,auVar227);
  auVar7 = vcmpps_avx(auVar7,auVar173,1);
  auVar9 = vblendvps_avx(auVar98,auVar173,auVar7);
  auVar7 = vandps_avx(auVar227,auVar174);
  auVar7 = vcmpps_avx(auVar7,auVar173,1);
  auVar7 = vblendvps_avx(auVar174,auVar173,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar218);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar8,auVar218);
  auVar11 = vfmadd132ps_fma(auVar9,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar218);
  auVar73 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar9 = vsubps_avx(auVar7,auVar12);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar174._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar174._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar174._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar174._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar188._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar188._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar188._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar188._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar62 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vsubps_avx(auVar7,auVar72);
  auVar98._1_3_ = 0;
  auVar98[0] = PVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar202._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar202._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar202._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar202._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar72);
  auVar97._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar97._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar97._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar97._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar62 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar81);
  auVar147._0_4_ = auVar73._0_4_ * auVar7._0_4_;
  auVar147._4_4_ = auVar73._4_4_ * auVar7._4_4_;
  auVar147._8_4_ = auVar73._8_4_ * auVar7._8_4_;
  auVar147._12_4_ = auVar73._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar81);
  auVar72._0_4_ = auVar73._0_4_ * auVar7._0_4_;
  auVar72._4_4_ = auVar73._4_4_ * auVar7._4_4_;
  auVar72._8_4_ = auVar73._8_4_ * auVar7._8_4_;
  auVar72._12_4_ = auVar73._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar174,auVar188);
  auVar8 = vpminsd_avx(auVar202,auVar97);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar147,auVar72);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar232._4_4_ = uVar66;
  auVar232._0_4_ = uVar66;
  auVar232._8_4_ = uVar66;
  auVar232._12_4_ = uVar66;
  auVar8 = vmaxps_avx(auVar8,auVar232);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_560._0_4_ = auVar7._0_4_ * 0.99999964;
  local_560._4_4_ = auVar7._4_4_ * 0.99999964;
  local_560._8_4_ = auVar7._8_4_ * 0.99999964;
  local_560._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar174,auVar188);
  auVar8 = vpmaxsd_avx(auVar202,auVar97);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar147,auVar72);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar81._4_4_ = uVar66;
  auVar81._0_4_ = uVar66;
  auVar81._8_4_ = uVar66;
  auVar81._12_4_ = uVar66;
  auVar8 = vminps_avx(auVar8,auVar81);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar73._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar98[4] = PVar3;
  auVar98._5_3_ = 0;
  auVar98[8] = PVar3;
  auVar98._9_3_ = 0;
  auVar98[0xc] = PVar3;
  auVar98._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar98,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_560,auVar73,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  uVar66 = vmovmskps_avx(auVar7);
  uVar62 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar66);
  local_500 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8e8 = prim;
LAB_0113e91e:
  if (uVar62 == 0) {
    return;
  }
  lVar64 = 0;
  for (uVar63 = uVar62; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar67 = *(uint *)(local_8e8 + 2);
  local_740 = *(uint *)(local_8e8 + lVar64 * 4 + 6);
  local_8e0 = (ulong)local_740;
  pGVar5 = (context->scene->geometries).items[uVar67].ptr;
  lVar64 = *(long *)&pGVar5[1].time_range.upper;
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_8e0 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar7 = *(undefined1 (*) [16])(lVar64 + (long)pGVar5[1].intersectionFilterN * uVar63);
  auVar8 = *(undefined1 (*) [16])(lVar64 + (long)pGVar5[1].intersectionFilterN * (uVar63 + 1));
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar233._4_4_ = uVar66;
  auVar233._0_4_ = uVar66;
  auVar233._8_4_ = uVar66;
  auVar233._12_4_ = uVar66;
  fStack_630 = (float)uVar66;
  _local_640 = auVar233;
  fStack_62c = (float)uVar66;
  fStack_628 = (float)uVar66;
  register0x0000145c = uVar66;
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar242._4_4_ = uVar66;
  auVar242._0_4_ = uVar66;
  auVar242._8_4_ = uVar66;
  auVar242._12_4_ = uVar66;
  fStack_610 = (float)uVar66;
  _local_620 = auVar242;
  fStack_60c = (float)uVar66;
  fStack_608 = (float)uVar66;
  register0x000014dc = uVar66;
  auVar246 = ZEXT3264(_local_620);
  auVar9 = vunpcklps_avx(auVar233,auVar242);
  fVar69 = *(float *)(ray + k * 4 + 0x60);
  auVar238._4_4_ = fVar69;
  auVar238._0_4_ = fVar69;
  auVar238._8_4_ = fVar69;
  auVar238._12_4_ = fVar69;
  fStack_870 = fVar69;
  _local_880 = auVar238;
  fStack_86c = fVar69;
  fStack_868 = fVar69;
  register0x0000149c = fVar69;
  local_970 = vinsertps_avx(auVar9,auVar238,0x28);
  auVar189._8_4_ = 0xbeaaaaab;
  auVar189._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar189._12_4_ = 0xbeaaaaab;
  auVar73 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              uVar63 * (long)pGVar5[2].pointQueryFunc),auVar7,auVar189);
  auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar5[2].intersectionFilterN +
                             (long)pGVar5[2].pointQueryFunc * (uVar63 + 1)),auVar8,auVar189);
  auVar190._0_4_ = (auVar8._0_4_ + auVar7._0_4_ + auVar73._0_4_ + auVar12._0_4_) * 0.25;
  auVar190._4_4_ = (auVar8._4_4_ + auVar7._4_4_ + auVar73._4_4_ + auVar12._4_4_) * 0.25;
  auVar190._8_4_ = (auVar8._8_4_ + auVar7._8_4_ + auVar73._8_4_ + auVar12._8_4_) * 0.25;
  auVar190._12_4_ = (auVar8._12_4_ + auVar7._12_4_ + auVar73._12_4_ + auVar12._12_4_) * 0.25;
  auVar9 = vsubps_avx(auVar190,auVar10);
  auVar9 = vdpps_avx(auVar9,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar11 = vrcpss_avx(local_980,local_980);
  auVar72 = vfnmadd213ss_fma(auVar11,local_980,ZEXT416(0x40000000));
  local_3c0 = auVar9._0_4_ * auVar11._0_4_ * auVar72._0_4_;
  auVar203._4_4_ = local_3c0;
  auVar203._0_4_ = local_3c0;
  auVar203._8_4_ = local_3c0;
  auVar203._12_4_ = local_3c0;
  fStack_8b0 = local_3c0;
  _local_8c0 = auVar203;
  fStack_8ac = local_3c0;
  fStack_8a8 = local_3c0;
  fStack_8a4 = local_3c0;
  auVar9 = vfmadd231ps_fma(auVar10,local_970,auVar203);
  auVar9 = vblendps_avx(auVar9,_DAT_01f45a50,8);
  auVar10 = vsubps_avx(auVar7,auVar9);
  auVar11 = vsubps_avx(auVar12,auVar9);
  auVar12 = vsubps_avx(auVar73,auVar9);
  auVar73 = vsubps_avx(auVar8,auVar9);
  auVar7 = vmovshdup_avx(auVar10);
  uVar70 = auVar7._0_8_;
  auVar181._8_8_ = uVar70;
  auVar181._0_8_ = uVar70;
  auVar181._16_8_ = uVar70;
  auVar181._24_8_ = uVar70;
  auVar7 = vshufps_avx(auVar10,auVar10,0xaa);
  local_8a0 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar10,auVar10,0xff);
  uVar70 = auVar7._0_8_;
  auVar207._8_8_ = uVar70;
  auVar207._0_8_ = uVar70;
  auVar207._16_8_ = uVar70;
  auVar207._24_8_ = uVar70;
  auVar7 = vmovshdup_avx(auVar12);
  local_580 = auVar7._0_8_;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  auVar7 = vshufps_avx(auVar12,auVar12,0xaa);
  uVar70 = auVar7._0_8_;
  local_960._8_8_ = uVar70;
  local_960._0_8_ = uVar70;
  local_960._16_8_ = uVar70;
  local_960._24_8_ = uVar70;
  auVar7 = vshufps_avx(auVar12,auVar12,0xff);
  uVar70 = auVar7._0_8_;
  auVar257._8_8_ = uVar70;
  auVar257._0_8_ = uVar70;
  auVar257._16_8_ = uVar70;
  auVar257._24_8_ = uVar70;
  auVar261 = ZEXT3264(auVar257);
  auVar7 = vmovshdup_avx(auVar11);
  local_1e0 = auVar7._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar8 = vshufps_avx(auVar11,auVar11,0xaa);
  uVar70 = auVar8._0_8_;
  auVar268._8_8_ = uVar70;
  auVar268._0_8_ = uVar70;
  auVar268._16_8_ = uVar70;
  auVar268._24_8_ = uVar70;
  auVar7 = vshufps_avx(auVar11,auVar11,0xff);
  local_4e0 = auVar7._0_4_;
  fStack_4dc = auVar7._4_4_;
  auVar7 = vmovshdup_avx(auVar73);
  local_200 = auVar7._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vshufps_avx(auVar73,auVar73,0xaa);
  local_220 = auVar7._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar7 = vshufps_avx(auVar73,auVar73,0xff);
  local_240 = auVar7._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar7 = vfmadd231ps_fma(ZEXT432((uint)(fVar69 * fVar69)),_local_620,_local_620);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_640,_local_640);
  uVar66 = auVar7._0_4_;
  local_260._4_4_ = uVar66;
  local_260._0_4_ = uVar66;
  local_260._8_4_ = uVar66;
  local_260._12_4_ = uVar66;
  local_260._16_4_ = uVar66;
  local_260._20_4_ = uVar66;
  local_260._24_4_ = uVar66;
  local_260._28_4_ = uVar66;
  auVar241 = ZEXT3264(local_260);
  fVar69 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_3c0);
  local_3c0 = fVar69 - local_3c0;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  uVar63 = 0;
  local_c44 = 1;
  uVar66 = auVar10._0_4_;
  local_380._4_4_ = uVar66;
  local_380._0_4_ = uVar66;
  local_380._8_4_ = uVar66;
  local_380._12_4_ = uVar66;
  local_380._16_4_ = uVar66;
  local_380._20_4_ = uVar66;
  local_380._24_4_ = uVar66;
  local_380._28_4_ = uVar66;
  fVar93 = auVar12._0_4_;
  local_3a0._4_4_ = fVar93;
  local_3a0._0_4_ = fVar93;
  local_3a0._8_4_ = fVar93;
  local_3a0._12_4_ = fVar93;
  local_3a0._16_4_ = fVar93;
  local_3a0._20_4_ = fVar93;
  local_3a0._24_4_ = fVar93;
  local_3a0._28_4_ = fVar93;
  fVar94 = auVar11._0_4_;
  local_280 = fVar94;
  fStack_27c = fVar94;
  fStack_278 = fVar94;
  fStack_274 = fVar94;
  fStack_270 = fVar94;
  fStack_26c = fVar94;
  fStack_268 = fVar94;
  fStack_264 = fVar94;
  auVar236 = ZEXT3264(CONCAT824(local_8a0,CONCAT816(local_8a0,CONCAT88(local_8a0,local_8a0))));
  auVar14._8_8_ = local_580;
  auVar14._0_8_ = local_580;
  auVar14._16_8_ = local_580;
  auVar14._24_8_ = local_580;
  fVar92 = auVar73._0_4_;
  local_2a0 = fVar92;
  fStack_29c = fVar92;
  fStack_298 = fVar92;
  fStack_294 = fVar92;
  fStack_290 = fVar92;
  fStack_28c = fVar92;
  fStack_288 = fVar92;
  fStack_284 = fVar92;
  local_660._8_4_ = 0x7fffffff;
  local_660._0_8_ = 0x7fffffff7fffffff;
  local_660._12_4_ = 0x7fffffff;
  local_660._16_4_ = 0x7fffffff;
  local_660._20_4_ = 0x7fffffff;
  local_660._24_4_ = 0x7fffffff;
  local_660._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_260,local_660);
  auVar7 = vsqrtss_avx(local_980,local_980);
  auVar9 = vsqrtss_avx(local_980,local_980);
  auVar248 = ZEXT3264(local_960);
  local_550 = ZEXT816(0x3f80000000000000);
  local_520 = auVar181;
  local_9e0 = auVar207;
  uStack_898 = local_8a0;
  uStack_890 = local_8a0;
  uStack_888 = local_8a0;
  uStack_73c = local_740;
  uStack_738 = local_740;
  uStack_734 = local_740;
  local_730 = uVar67;
  uStack_72c = uVar67;
  uStack_728 = uVar67;
  uStack_724 = uVar67;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  do {
    auVar72 = vmovshdup_avx(local_550);
    auVar72 = vsubps_avx(auVar72,local_550);
    fVar143 = auVar72._0_4_;
    fVar130 = fVar143 * 0.04761905;
    local_780._0_4_ = local_550._0_4_;
    local_780._4_4_ = local_780._0_4_;
    local_780._8_4_ = local_780._0_4_;
    local_780._12_4_ = local_780._0_4_;
    local_780._16_4_ = local_780._0_4_;
    local_780._20_4_ = local_780._0_4_;
    local_780._24_4_ = local_780._0_4_;
    local_780._28_4_ = local_780._0_4_;
    local_7a0._4_4_ = fVar143;
    local_7a0._0_4_ = fVar143;
    local_7a0._8_4_ = fVar143;
    local_7a0._12_4_ = fVar143;
    local_7a0._16_4_ = fVar143;
    local_7a0._20_4_ = fVar143;
    local_7a0._24_4_ = fVar143;
    local_7a0._28_4_ = fVar143;
    auVar72 = vfmadd231ps_fma(local_780,local_7a0,_DAT_01f7b040);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar111 = vsubps_avx(auVar112,ZEXT1632(auVar72));
    fVar131 = auVar72._0_4_;
    auVar210._0_4_ = local_3a0._0_4_ * fVar131;
    fVar95 = auVar72._4_4_;
    auVar210._4_4_ = local_3a0._4_4_ * fVar95;
    fVar142 = auVar72._8_4_;
    auVar210._8_4_ = local_3a0._8_4_ * fVar142;
    fVar125 = auVar72._12_4_;
    auVar210._12_4_ = local_3a0._12_4_ * fVar125;
    auVar210._16_4_ = local_3a0._16_4_ * 0.0;
    auVar210._20_4_ = local_3a0._20_4_ * 0.0;
    auVar210._28_36_ = auVar246._28_36_;
    auVar210._24_4_ = local_3a0._24_4_ * 0.0;
    auVar246._0_4_ = auVar14._0_4_ * fVar131;
    auVar246._4_4_ = auVar14._4_4_ * fVar95;
    auVar246._8_4_ = auVar14._8_4_ * fVar142;
    auVar246._12_4_ = auVar14._12_4_ * fVar125;
    auVar246._16_4_ = auVar14._16_4_ * 0.0;
    auVar246._20_4_ = auVar14._20_4_ * 0.0;
    auVar246._28_36_ = auVar241._28_36_;
    auVar246._24_4_ = auVar14._24_4_ * 0.0;
    auVar167._4_4_ = auVar248._4_4_ * fVar95;
    auVar167._0_4_ = auVar248._0_4_ * fVar131;
    auVar167._8_4_ = auVar248._8_4_ * fVar142;
    auVar167._12_4_ = auVar248._12_4_ * fVar125;
    auVar167._16_4_ = auVar248._16_4_ * 0.0;
    auVar167._20_4_ = auVar248._20_4_ * 0.0;
    auVar167._24_4_ = auVar248._24_4_ * 0.0;
    auVar167._28_4_ = fVar143;
    auVar59._4_4_ = auVar261._4_4_ * fVar95;
    auVar59._0_4_ = auVar261._0_4_ * fVar131;
    auVar59._8_4_ = auVar261._8_4_ * fVar142;
    auVar59._12_4_ = auVar261._12_4_ * fVar125;
    auVar59._16_4_ = auVar261._16_4_ * 0.0;
    auVar59._20_4_ = auVar261._20_4_ * 0.0;
    auVar59._24_4_ = auVar261._24_4_ * 0.0;
    auVar59._28_4_ = DAT_01f7b040._28_4_;
    auVar72 = vfmadd231ps_fma(auVar210._0_32_,auVar111,local_380);
    auVar81 = vfmadd231ps_fma(auVar246._0_32_,auVar111,auVar181);
    auVar97 = vfmadd231ps_fma(auVar167,auVar111,auVar236._0_32_);
    auVar76 = vfmadd231ps_fma(auVar59,auVar111,auVar207);
    auVar56._4_4_ = fStack_27c;
    auVar56._0_4_ = local_280;
    auVar56._8_4_ = fStack_278;
    auVar56._12_4_ = fStack_274;
    auVar56._16_4_ = fStack_270;
    auVar56._20_4_ = fStack_26c;
    auVar56._24_4_ = fStack_268;
    auVar56._28_4_ = fStack_264;
    auVar170._4_4_ = fStack_27c * fVar95;
    auVar170._0_4_ = local_280 * fVar131;
    auVar170._8_4_ = fStack_278 * fVar142;
    auVar170._12_4_ = fStack_274 * fVar125;
    auVar170._16_4_ = fStack_270 * 0.0;
    auVar170._20_4_ = fStack_26c * 0.0;
    auVar170._24_4_ = fStack_268 * 0.0;
    auVar170._28_4_ = auVar207._28_4_;
    auVar57._8_8_ = uStack_1d8;
    auVar57._0_8_ = local_1e0;
    auVar57._16_8_ = uStack_1d0;
    auVar57._24_8_ = uStack_1c8;
    auVar184._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar95;
    auVar184._0_4_ = (float)local_1e0 * fVar131;
    auVar184._8_4_ = (float)uStack_1d8 * fVar142;
    auVar184._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar125;
    auVar184._16_4_ = (float)uStack_1d0 * 0.0;
    auVar184._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar184._24_4_ = (float)uStack_1c8 * 0.0;
    auVar184._28_4_ = local_380._28_4_;
    fVar143 = auVar8._0_4_;
    fVar144 = auVar8._4_4_;
    auVar15._4_4_ = fVar144 * fVar95;
    auVar15._0_4_ = fVar143 * fVar131;
    auVar15._8_4_ = fVar143 * fVar142;
    auVar15._12_4_ = fVar144 * fVar125;
    auVar15._16_4_ = fVar143 * 0.0;
    auVar15._20_4_ = fVar144 * 0.0;
    auVar15._24_4_ = fVar143 * 0.0;
    auVar15._28_4_ = auVar181._28_4_;
    auVar162._0_4_ = fVar131 * local_4e0;
    auVar162._4_4_ = fVar95 * fStack_4dc;
    auVar162._8_4_ = fVar142 * fStack_4d8;
    auVar162._12_4_ = fVar125 * fStack_4d4;
    auVar162._16_4_ = fStack_4d0 * 0.0;
    auVar162._20_4_ = fStack_4cc * 0.0;
    auVar162._24_4_ = fStack_4c8 * 0.0;
    auVar162._28_4_ = 0;
    auVar98 = vfmadd231ps_fma(auVar170,auVar111,local_3a0);
    auVar147 = vfmadd231ps_fma(auVar184,auVar111,auVar14);
    auVar174 = vfmadd231ps_fma(auVar15,auVar111,auVar248._0_32_);
    auVar71 = vfmadd231ps_fma(auVar162,auVar111,auVar261._0_32_);
    auVar241._0_4_ = fVar131 * local_2a0;
    auVar241._4_4_ = fVar95 * fStack_29c;
    auVar241._8_4_ = fVar142 * fStack_298;
    auVar241._12_4_ = fVar125 * fStack_294;
    auVar241._16_4_ = fStack_290 * 0.0;
    auVar241._20_4_ = fStack_28c * 0.0;
    auVar241._28_36_ = auVar261._28_36_;
    auVar241._24_4_ = fStack_288 * 0.0;
    auVar236._0_4_ = fVar131 * (float)local_200;
    auVar236._4_4_ = fVar95 * local_200._4_4_;
    auVar236._8_4_ = fVar142 * (float)uStack_1f8;
    auVar236._12_4_ = fVar125 * uStack_1f8._4_4_;
    auVar236._16_4_ = (float)uStack_1f0 * 0.0;
    auVar236._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar236._28_36_ = auVar248._28_36_;
    auVar236._24_4_ = (float)uStack_1e8 * 0.0;
    auVar230._28_4_ = local_3a0._28_4_;
    auVar230._0_28_ =
         ZEXT1628(CONCAT412(auVar98._12_4_ * fVar125,
                            CONCAT48(auVar98._8_4_ * fVar142,
                                     CONCAT44(auVar98._4_4_ * fVar95,auVar98._0_4_ * fVar131))));
    auVar72 = vfmadd231ps_fma(auVar230,auVar111,ZEXT1632(auVar72));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar147._12_4_,
                                                 CONCAT48(fVar142 * auVar147._8_4_,
                                                          CONCAT44(fVar95 * auVar147._4_4_,
                                                                   fVar131 * auVar147._0_4_)))),
                              auVar111,ZEXT1632(auVar81));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar174._12_4_,
                                                 CONCAT48(fVar142 * auVar174._8_4_,
                                                          CONCAT44(fVar95 * auVar174._4_4_,
                                                                   fVar131 * auVar174._0_4_)))),
                              auVar111,ZEXT1632(auVar97));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar71._12_4_,
                                                 CONCAT48(fVar142 * auVar71._8_4_,
                                                          CONCAT44(fVar95 * auVar71._4_4_,
                                                                   fVar131 * auVar71._0_4_)))),
                              auVar111,ZEXT1632(auVar76));
    auVar209._4_4_ = fVar95 * local_220._4_4_;
    auVar209._0_4_ = fVar131 * (float)local_220;
    auVar209._8_4_ = fVar142 * (float)uStack_218;
    auVar209._12_4_ = fVar125 * uStack_218._4_4_;
    auVar209._16_4_ = (float)uStack_210 * 0.0;
    auVar209._20_4_ = uStack_210._4_4_ * 0.0;
    auVar209._24_4_ = (float)uStack_208 * 0.0;
    auVar209._28_4_ = auVar14._28_4_;
    auVar96 = vfmadd231ps_fma(auVar241._0_32_,auVar111,auVar56);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * fVar125,
                                                 CONCAT48(auVar96._8_4_ * fVar142,
                                                          CONCAT44(auVar96._4_4_ * fVar95,
                                                                   auVar96._0_4_ * fVar131)))),
                              auVar111,ZEXT1632(auVar98));
    auVar228._0_4_ = fVar131 * (float)local_240;
    auVar228._4_4_ = fVar95 * local_240._4_4_;
    auVar228._8_4_ = fVar142 * (float)uStack_238;
    auVar228._12_4_ = fVar125 * uStack_238._4_4_;
    auVar228._16_4_ = (float)uStack_230 * 0.0;
    auVar228._20_4_ = uStack_230._4_4_ * 0.0;
    auVar228._24_4_ = (float)uStack_228 * 0.0;
    auVar228._28_4_ = 0;
    auVar96 = vfmadd231ps_fma(auVar236._0_32_,auVar111,auVar57);
    auVar173 = vfmadd231ps_fma(auVar209,auVar111,auVar268);
    auVar53._4_4_ = fStack_4dc;
    auVar53._0_4_ = local_4e0;
    auVar53._8_4_ = fStack_4d8;
    auVar53._12_4_ = fStack_4d4;
    auVar53._16_4_ = fStack_4d0;
    auVar53._20_4_ = fStack_4cc;
    auVar53._24_4_ = fStack_4c8;
    auVar53._28_4_ = fStack_4c4;
    auVar186 = vfmadd231ps_fma(auVar228,auVar111,auVar53);
    auVar163._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar163._0_28_ =
         ZEXT1628(CONCAT412(auVar186._12_4_ * fVar125,
                            CONCAT48(auVar186._8_4_ * fVar142,
                                     CONCAT44(auVar186._4_4_ * fVar95,auVar186._0_4_ * fVar131))));
    auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * fVar125,
                                                  CONCAT48(auVar96._8_4_ * fVar142,
                                                           CONCAT44(auVar96._4_4_ * fVar95,
                                                                    auVar96._0_4_ * fVar131)))),
                               auVar111,ZEXT1632(auVar147));
    auVar174 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar173._12_4_,
                                                  CONCAT48(fVar142 * auVar173._8_4_,
                                                           CONCAT44(fVar95 * auVar173._4_4_,
                                                                    fVar131 * auVar173._0_4_)))),
                               auVar111,ZEXT1632(auVar174));
    auVar71 = vfmadd231ps_fma(auVar163,auVar111,ZEXT1632(auVar71));
    auVar60._28_4_ = fVar144;
    auVar60._0_28_ =
         ZEXT1628(CONCAT412(fVar125 * auVar174._12_4_,
                            CONCAT48(fVar142 * auVar174._8_4_,
                                     CONCAT44(fVar95 * auVar174._4_4_,fVar131 * auVar174._0_4_))));
    auVar243._28_4_ = fStack_264;
    auVar243._0_28_ =
         ZEXT1628(CONCAT412(auVar71._12_4_ * fVar125,
                            CONCAT48(auVar71._8_4_ * fVar142,
                                     CONCAT44(auVar71._4_4_ * fVar95,auVar71._0_4_ * fVar131))));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar125,
                                                 CONCAT48(auVar98._8_4_ * fVar142,
                                                          CONCAT44(auVar98._4_4_ * fVar95,
                                                                   auVar98._0_4_ * fVar131)))),
                              auVar111,ZEXT1632(auVar72));
    auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar147._12_4_ * fVar125,
                                                  CONCAT48(auVar147._8_4_ * fVar142,
                                                           CONCAT44(auVar147._4_4_ * fVar95,
                                                                    auVar147._0_4_ * fVar131)))),
                               auVar111,ZEXT1632(auVar81));
    auVar186 = vfmadd231ps_fma(auVar60,auVar111,ZEXT1632(auVar97));
    auVar187 = vfmadd231ps_fma(auVar243,ZEXT1632(auVar76),auVar111);
    auVar181 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar72));
    auVar111 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar81));
    auVar14 = vsubps_avx(ZEXT1632(auVar174),ZEXT1632(auVar97));
    auVar207 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar76));
    local_760._0_4_ = fVar130 * auVar181._0_4_ * 3.0;
    local_760._4_4_ = fVar130 * auVar181._4_4_ * 3.0;
    local_760._8_4_ = fVar130 * auVar181._8_4_ * 3.0;
    local_760._12_4_ = fVar130 * auVar181._12_4_ * 3.0;
    local_760._16_4_ = fVar130 * auVar181._16_4_ * 3.0;
    local_760._20_4_ = fVar130 * auVar181._20_4_ * 3.0;
    local_760._24_4_ = fVar130 * auVar181._24_4_ * 3.0;
    local_760._28_4_ = 0;
    fVar201 = fVar130 * auVar111._0_4_ * 3.0;
    fVar211 = fVar130 * auVar111._4_4_ * 3.0;
    local_aa0._4_4_ = fVar211;
    local_aa0._0_4_ = fVar201;
    fVar212 = fVar130 * auVar111._8_4_ * 3.0;
    local_aa0._8_4_ = fVar212;
    fVar213 = fVar130 * auVar111._12_4_ * 3.0;
    local_aa0._12_4_ = fVar213;
    fVar214 = fVar130 * auVar111._16_4_ * 3.0;
    local_aa0._16_4_ = fVar214;
    fVar215 = fVar130 * auVar111._20_4_ * 3.0;
    local_aa0._20_4_ = fVar215;
    fVar216 = fVar130 * auVar111._24_4_ * 3.0;
    local_aa0._24_4_ = fVar216;
    local_aa0._28_4_ = auVar14._28_4_;
    auVar239._0_4_ = fVar130 * auVar14._0_4_ * 3.0;
    auVar239._4_4_ = fVar130 * auVar14._4_4_ * 3.0;
    auVar239._8_4_ = fVar130 * auVar14._8_4_ * 3.0;
    auVar239._12_4_ = fVar130 * auVar14._12_4_ * 3.0;
    auVar239._16_4_ = fVar130 * auVar14._16_4_ * 3.0;
    auVar239._20_4_ = fVar130 * auVar14._20_4_ * 3.0;
    auVar239._24_4_ = fVar130 * auVar14._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    fVar95 = fVar130 * auVar207._0_4_ * 3.0;
    fVar125 = fVar130 * auVar207._4_4_ * 3.0;
    auVar165._4_4_ = fVar125;
    auVar165._0_4_ = fVar95;
    fVar126 = fVar130 * auVar207._8_4_ * 3.0;
    auVar165._8_4_ = fVar126;
    fVar127 = fVar130 * auVar207._12_4_ * 3.0;
    auVar165._12_4_ = fVar127;
    fVar128 = fVar130 * auVar207._16_4_ * 3.0;
    auVar165._16_4_ = fVar128;
    fVar129 = fVar130 * auVar207._20_4_ * 3.0;
    auVar165._20_4_ = fVar129;
    fVar130 = fVar130 * auVar207._24_4_ * 3.0;
    auVar165._24_4_ = fVar130;
    auVar165._28_4_ = auVar181._28_4_;
    auVar163 = ZEXT1632(auVar96);
    auVar15 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar96));
    _local_940 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar173));
    local_a80 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar186));
    local_2e0 = vsubps_avx(auVar15,auVar163);
    local_2c0 = vsubps_avx(local_a80,ZEXT1632(auVar186));
    fVar131 = local_2c0._0_4_;
    fVar142 = local_2c0._4_4_;
    auVar270._4_4_ = local_760._4_4_ * fVar142;
    auVar270._0_4_ = local_760._0_4_ * fVar131;
    fVar143 = local_2c0._8_4_;
    auVar270._8_4_ = local_760._8_4_ * fVar143;
    fVar144 = local_2c0._12_4_;
    auVar270._12_4_ = local_760._12_4_ * fVar144;
    fVar146 = local_2c0._16_4_;
    auVar270._16_4_ = local_760._16_4_ * fVar146;
    fVar172 = local_2c0._20_4_;
    auVar270._20_4_ = local_760._20_4_ * fVar172;
    fVar145 = local_2c0._24_4_;
    auVar270._24_4_ = local_760._24_4_ * fVar145;
    auVar270._28_4_ = local_a80._28_4_;
    auVar72 = vfmsub231ps_fma(auVar270,auVar239,local_2e0);
    local_300 = vsubps_avx(_local_940,ZEXT1632(auVar173));
    fVar249 = local_2e0._0_4_;
    fVar250 = local_2e0._4_4_;
    auVar13._4_4_ = fVar250 * fVar211;
    auVar13._0_4_ = fVar249 * fVar201;
    fVar251 = local_2e0._8_4_;
    auVar13._8_4_ = fVar251 * fVar212;
    fVar253 = local_2e0._12_4_;
    auVar13._12_4_ = fVar253 * fVar213;
    fVar255 = local_2e0._16_4_;
    auVar13._16_4_ = fVar255 * fVar214;
    fVar252 = local_2e0._20_4_;
    auVar13._20_4_ = fVar252 * fVar215;
    fVar254 = local_2e0._24_4_;
    auVar13._24_4_ = fVar254 * fVar216;
    auVar13._28_4_ = auVar15._28_4_;
    auVar81 = vfmsub231ps_fma(auVar13,local_760,local_300);
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar81._12_4_ * auVar81._12_4_,
                                                 CONCAT48(auVar81._8_4_ * auVar81._8_4_,
                                                          CONCAT44(auVar81._4_4_ * auVar81._4_4_,
                                                                   auVar81._0_4_ * auVar81._0_4_))))
                              ,ZEXT1632(auVar72),ZEXT1632(auVar72));
    auVar164._0_4_ = fVar131 * fVar131;
    auVar164._4_4_ = fVar142 * fVar142;
    auVar164._8_4_ = fVar143 * fVar143;
    auVar164._12_4_ = fVar144 * fVar144;
    auVar164._16_4_ = fVar146 * fVar146;
    auVar164._20_4_ = fVar172 * fVar172;
    auVar164._24_4_ = fVar145 * fVar145;
    auVar164._28_4_ = 0;
    auVar81 = vfmadd231ps_fma(auVar164,local_300,local_300);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2e0,local_2e0);
    fVar201 = local_300._0_4_;
    fVar211 = local_300._4_4_;
    auVar17._4_4_ = fVar211 * auVar239._4_4_;
    auVar17._0_4_ = fVar201 * auVar239._0_4_;
    fVar212 = local_300._8_4_;
    auVar17._8_4_ = fVar212 * auVar239._8_4_;
    fVar213 = local_300._12_4_;
    auVar17._12_4_ = fVar213 * auVar239._12_4_;
    fVar214 = local_300._16_4_;
    auVar17._16_4_ = fVar214 * auVar239._16_4_;
    fVar215 = local_300._20_4_;
    auVar17._20_4_ = fVar215 * auVar239._20_4_;
    fVar216 = local_300._24_4_;
    auVar17._24_4_ = fVar216 * auVar239._24_4_;
    auVar17._28_4_ = local_940._28_4_;
    auVar111 = vrcpps_avx(ZEXT1632(auVar81));
    auVar97 = vfmsub231ps_fma(auVar17,local_aa0,local_2c0);
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar72),ZEXT1632(auVar97),ZEXT1632(auVar97));
    auVar264._8_4_ = 0x3f800000;
    auVar264._0_8_ = 0x3f8000003f800000;
    auVar264._12_4_ = 0x3f800000;
    auVar264._16_4_ = 0x3f800000;
    auVar264._20_4_ = 0x3f800000;
    auVar264._24_4_ = 0x3f800000;
    auVar264._28_4_ = 0x3f800000;
    auVar72 = vfnmadd213ps_fma(auVar111,ZEXT1632(auVar81),auVar264);
    auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar111,auVar111);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,local_760);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar239);
    auVar18._4_4_ = local_9c0._4_4_ * fVar142;
    auVar18._0_4_ = local_9c0._0_4_ * fVar131;
    auVar18._8_4_ = local_9c0._8_4_ * fVar143;
    auVar18._12_4_ = local_9c0._12_4_ * fVar144;
    auVar18._16_4_ = local_9c0._16_4_ * fVar146;
    auVar18._20_4_ = local_9c0._20_4_ * fVar172;
    auVar18._24_4_ = local_9c0._24_4_ * fVar145;
    auVar18._28_4_ = auVar111._28_4_;
    auVar76 = vfmsub231ps_fma(auVar18,local_a00,local_2e0);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_aa0);
    auVar19._4_4_ = fVar250 * local_a20._4_4_;
    auVar19._0_4_ = fVar249 * local_a20._0_4_;
    auVar19._8_4_ = fVar251 * local_a20._8_4_;
    auVar19._12_4_ = fVar253 * local_a20._12_4_;
    auVar19._16_4_ = fVar255 * local_a20._16_4_;
    auVar19._20_4_ = fVar252 * local_a20._20_4_;
    auVar19._24_4_ = fVar254 * local_a20._24_4_;
    auVar19._28_4_ = auVar14._28_4_;
    auVar98 = vfmsub231ps_fma(auVar19,local_9c0,local_300);
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * auVar98._12_4_,
                                                 CONCAT48(auVar98._8_4_ * auVar98._8_4_,
                                                          CONCAT44(auVar98._4_4_ * auVar98._4_4_,
                                                                   auVar98._0_4_ * auVar98._0_4_))))
                              ,ZEXT1632(auVar76),ZEXT1632(auVar76));
    auVar196._0_4_ = fVar201 * local_a00._0_4_;
    auVar196._4_4_ = fVar211 * local_a00._4_4_;
    auVar196._8_4_ = fVar212 * local_a00._8_4_;
    auVar196._12_4_ = fVar213 * local_a00._12_4_;
    auVar196._16_4_ = fVar214 * local_a00._16_4_;
    auVar196._20_4_ = fVar215 * local_a00._20_4_;
    auVar196._24_4_ = fVar216 * local_a00._24_4_;
    auVar196._28_4_ = 0;
    auVar98 = vfmsub231ps_fma(auVar196,local_a20,local_2c0);
    auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar111 = vmaxps_avx(ZEXT1632(CONCAT412(auVar97._12_4_ * auVar72._12_4_,
                                             CONCAT48(auVar97._8_4_ * auVar72._8_4_,
                                                      CONCAT44(auVar97._4_4_ * auVar72._4_4_,
                                                               auVar97._0_4_ * auVar72._0_4_)))),
                          ZEXT1632(CONCAT412(auVar76._12_4_ * auVar72._12_4_,
                                             CONCAT48(auVar76._8_4_ * auVar72._8_4_,
                                                      CONCAT44(auVar76._4_4_ * auVar72._4_4_,
                                                               auVar76._0_4_ * auVar72._0_4_)))));
    local_7e0._0_4_ = auVar187._0_4_ + fVar95;
    local_7e0._4_4_ = auVar187._4_4_ + fVar125;
    local_7e0._8_4_ = auVar187._8_4_ + fVar126;
    local_7e0._12_4_ = auVar187._12_4_ + fVar127;
    local_7e0._16_4_ = fVar128 + 0.0;
    local_7e0._20_4_ = fVar129 + 0.0;
    local_7e0._24_4_ = fVar130 + 0.0;
    local_7e0._28_4_ = auVar181._28_4_ + 0.0;
    local_7c0 = ZEXT1632(auVar187);
    auVar181 = vsubps_avx(local_7c0,auVar165);
    auVar230 = vpermps_avx2(_DAT_01fb7720,auVar181);
    auVar209 = vpermps_avx2(_DAT_01fb7720,local_7c0);
    auVar181 = vmaxps_avx(local_7c0,local_7e0);
    auVar207 = vrsqrtps_avx(ZEXT1632(auVar81));
    auVar14 = vmaxps_avx(auVar230,auVar209);
    auVar181 = vmaxps_avx(auVar181,auVar14);
    fVar95 = auVar207._0_4_;
    fVar125 = auVar207._4_4_;
    fVar130 = auVar207._8_4_;
    fVar126 = auVar207._12_4_;
    fVar127 = auVar207._16_4_;
    fVar128 = auVar207._20_4_;
    fVar129 = auVar207._24_4_;
    auVar58._4_4_ = fVar125 * fVar125 * fVar125 * auVar81._4_4_ * -0.5;
    auVar58._0_4_ = fVar95 * fVar95 * fVar95 * auVar81._0_4_ * -0.5;
    auVar58._8_4_ = fVar130 * fVar130 * fVar130 * auVar81._8_4_ * -0.5;
    auVar58._12_4_ = fVar126 * fVar126 * fVar126 * auVar81._12_4_ * -0.5;
    auVar58._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar58._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
    auVar58._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar58._28_4_ = DAT_01fb7720._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar72 = vfmadd231ps_fma(auVar58,auVar113,auVar207);
    fVar95 = auVar72._0_4_;
    fVar125 = auVar72._4_4_;
    auVar20._4_4_ = fVar211 * fVar125;
    auVar20._0_4_ = fVar201 * fVar95;
    fVar130 = auVar72._8_4_;
    auVar20._8_4_ = fVar212 * fVar130;
    fVar126 = auVar72._12_4_;
    auVar20._12_4_ = fVar213 * fVar126;
    auVar20._16_4_ = fVar214 * 0.0;
    auVar20._20_4_ = fVar215 * 0.0;
    auVar20._24_4_ = fVar216 * 0.0;
    auVar20._28_4_ = 0;
    auVar21._4_4_ = (float)local_880._4_4_ * fVar125 * fVar142;
    auVar21._0_4_ = (float)local_880._0_4_ * fVar95 * fVar131;
    auVar21._8_4_ = fStack_878 * fVar130 * fVar143;
    auVar21._12_4_ = fStack_874 * fVar126 * fVar144;
    auVar21._16_4_ = fStack_870 * fVar146 * 0.0;
    auVar21._20_4_ = fStack_86c * fVar172 * 0.0;
    auVar21._24_4_ = fStack_868 * fVar145 * 0.0;
    auVar21._28_4_ = local_300._28_4_;
    auVar81 = vfmadd231ps_fma(auVar21,auVar20,_local_620);
    local_5e0 = ZEXT1632(auVar186);
    auVar207 = vsubps_avx(ZEXT832(0) << 0x20,local_5e0);
    fVar127 = auVar207._0_4_;
    auVar269._0_4_ = fVar127 * fVar95 * fVar131;
    fVar128 = auVar207._4_4_;
    auVar269._4_4_ = fVar128 * fVar125 * fVar142;
    fVar129 = auVar207._8_4_;
    auVar269._8_4_ = fVar129 * fVar130 * fVar143;
    fVar201 = auVar207._12_4_;
    auVar269._12_4_ = fVar201 * fVar126 * fVar144;
    fVar211 = auVar207._16_4_;
    auVar269._16_4_ = fVar211 * fVar146 * 0.0;
    fVar146 = auVar207._20_4_;
    auVar269._20_4_ = fVar146 * fVar172 * 0.0;
    fVar172 = auVar207._24_4_;
    auVar269._24_4_ = fVar172 * fVar145 * 0.0;
    auVar269._28_4_ = 0;
    local_600 = ZEXT1632(auVar173);
    auVar167 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    auVar97 = vfmadd231ps_fma(auVar269,auVar167,auVar20);
    auVar22._4_4_ = fVar250 * fVar125;
    auVar22._0_4_ = fVar249 * fVar95;
    auVar22._8_4_ = fVar251 * fVar130;
    auVar22._12_4_ = fVar253 * fVar126;
    auVar22._16_4_ = fVar255 * 0.0;
    auVar22._20_4_ = fVar252 * 0.0;
    auVar22._24_4_ = fVar254 * 0.0;
    auVar22._28_4_ = auVar14._28_4_;
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar22,_local_640);
    auVar246 = ZEXT1664(auVar81);
    auVar165 = ZEXT832(0) << 0x20;
    auVar170 = vsubps_avx(auVar165,auVar163);
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar170,auVar22);
    auVar23._4_4_ = (float)local_880._4_4_ * fVar128;
    auVar23._0_4_ = (float)local_880._0_4_ * fVar127;
    auVar23._8_4_ = fStack_878 * fVar129;
    auVar23._12_4_ = fStack_874 * fVar201;
    auVar23._16_4_ = fStack_870 * fVar211;
    auVar23._20_4_ = fStack_86c * fVar146;
    auVar23._24_4_ = fStack_868 * fVar172;
    auVar23._28_4_ = auVar14._28_4_;
    auVar76 = vfmadd231ps_fma(auVar23,_local_620,auVar167);
    auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_640,auVar170);
    fVar131 = auVar97._0_4_;
    fVar214 = auVar81._0_4_;
    fVar142 = auVar97._4_4_;
    fVar215 = auVar81._4_4_;
    fVar143 = auVar97._8_4_;
    fVar216 = auVar81._8_4_;
    fVar144 = auVar97._12_4_;
    fVar249 = auVar81._12_4_;
    auVar24._28_4_ = local_620._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar249 * fVar144,
                            CONCAT48(fVar216 * fVar143,CONCAT44(fVar215 * fVar142,fVar214 * fVar131)
                                    )));
    auVar14 = vsubps_avx(ZEXT1632(auVar76),auVar24);
    auVar25._4_4_ = fVar128 * fVar128;
    auVar25._0_4_ = fVar127 * fVar127;
    auVar25._8_4_ = fVar129 * fVar129;
    auVar25._12_4_ = fVar201 * fVar201;
    auVar25._16_4_ = fVar211 * fVar211;
    auVar25._20_4_ = fVar146 * fVar146;
    auVar25._24_4_ = fVar172 * fVar172;
    auVar25._28_4_ = local_620._28_4_;
    auVar76 = vfmadd231ps_fma(auVar25,auVar167,auVar167);
    auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar170,auVar170);
    auVar26._28_4_ = local_2e0._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar144 * fVar144,
                            CONCAT48(fVar143 * fVar143,CONCAT44(fVar142 * fVar142,fVar131 * fVar131)
                                    )));
    auVar184 = vsubps_avx(ZEXT1632(auVar76),auVar26);
    local_5a0 = vsqrtps_avx(auVar111);
    fVar131 = (auVar181._0_4_ + local_5a0._0_4_) * 1.0000002;
    fVar142 = (auVar181._4_4_ + local_5a0._4_4_) * 1.0000002;
    fVar143 = (auVar181._8_4_ + local_5a0._8_4_) * 1.0000002;
    fVar144 = (auVar181._12_4_ + local_5a0._12_4_) * 1.0000002;
    fVar145 = (auVar181._16_4_ + local_5a0._16_4_) * 1.0000002;
    fVar212 = (auVar181._20_4_ + local_5a0._20_4_) * 1.0000002;
    fVar213 = (auVar181._24_4_ + local_5a0._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar142 * fVar142;
    auVar27._0_4_ = fVar131 * fVar131;
    auVar27._8_4_ = fVar143 * fVar143;
    auVar27._12_4_ = fVar144 * fVar144;
    auVar27._16_4_ = fVar145 * fVar145;
    auVar27._20_4_ = fVar212 * fVar212;
    auVar27._24_4_ = fVar213 * fVar213;
    auVar27._28_4_ = auVar181._28_4_ + local_5a0._28_4_;
    local_340._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    local_340._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    local_340._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    local_340._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    local_340._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    local_340._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    local_340._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    fVar131 = auVar14._28_4_;
    local_340._28_4_ = fVar131 + fVar131;
    auVar14 = vsubps_avx(auVar184,auVar27);
    auVar243 = ZEXT1632(auVar81);
    local_320._28_4_ = auVar181._28_4_;
    local_320._0_28_ =
         ZEXT1628(CONCAT412(fVar249 * fVar249,
                            CONCAT48(fVar216 * fVar216,CONCAT44(fVar215 * fVar215,fVar214 * fVar214)
                                    )));
    local_ac0 = vsubps_avx(local_260,local_320);
    auVar28._4_4_ = local_340._4_4_ * local_340._4_4_;
    auVar28._0_4_ = local_340._0_4_ * local_340._0_4_;
    auVar28._8_4_ = local_340._8_4_ * local_340._8_4_;
    auVar28._12_4_ = local_340._12_4_ * local_340._12_4_;
    auVar28._16_4_ = local_340._16_4_ * local_340._16_4_;
    auVar28._20_4_ = local_340._20_4_ * local_340._20_4_;
    auVar28._24_4_ = local_340._24_4_ * local_340._24_4_;
    auVar28._28_4_ = fVar131;
    fVar131 = local_ac0._0_4_;
    local_5c0._0_4_ = fVar131 * 4.0;
    fVar142 = local_ac0._4_4_;
    local_5c0._4_4_ = fVar142 * 4.0;
    fVar143 = local_ac0._8_4_;
    fStack_5b8 = fVar143 * 4.0;
    fVar144 = local_ac0._12_4_;
    fStack_5b4 = fVar144 * 4.0;
    fVar145 = local_ac0._16_4_;
    fStack_5b0 = fVar145 * 4.0;
    fVar212 = local_ac0._20_4_;
    fStack_5ac = fVar212 * 4.0;
    fVar213 = local_ac0._24_4_;
    fStack_5a8 = fVar213 * 4.0;
    uStack_5a4 = 0x40800000;
    auVar29._4_4_ = (float)local_5c0._4_4_ * auVar14._4_4_;
    auVar29._0_4_ = (float)local_5c0._0_4_ * auVar14._0_4_;
    auVar29._8_4_ = fStack_5b8 * auVar14._8_4_;
    auVar29._12_4_ = fStack_5b4 * auVar14._12_4_;
    auVar29._16_4_ = fStack_5b0 * auVar14._16_4_;
    auVar29._20_4_ = fStack_5ac * auVar14._20_4_;
    auVar29._24_4_ = fStack_5a8 * auVar14._24_4_;
    auVar29._28_4_ = 0x40800000;
    auVar181 = vsubps_avx(auVar28,auVar29);
    auVar111 = vcmpps_avx(auVar181,auVar165,5);
    local_680._8_4_ = 0x80000000;
    local_680._0_8_ = 0x8000000080000000;
    local_680._12_4_ = 0x80000000;
    local_680._16_4_ = 0x80000000;
    local_680._20_4_ = 0x80000000;
    local_680._24_4_ = 0x80000000;
    local_680._28_4_ = 0x80000000;
    local_360._0_4_ = fVar131 + fVar131;
    local_360._4_4_ = fVar142 + fVar142;
    local_360._8_4_ = fVar143 + fVar143;
    local_360._12_4_ = fVar144 + fVar144;
    local_360._16_4_ = fVar145 + fVar145;
    local_360._20_4_ = fVar212 + fVar212;
    local_360._24_4_ = fVar213 + fVar213;
    local_360._28_4_ = local_ac0._28_4_ + local_ac0._28_4_;
    auVar270 = ZEXT1632(auVar97);
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      auVar258._8_4_ = 0x7f800000;
      auVar258._0_8_ = 0x7f8000007f800000;
      auVar258._12_4_ = 0x7f800000;
      auVar258._16_4_ = 0x7f800000;
      auVar258._20_4_ = 0x7f800000;
      auVar258._24_4_ = 0x7f800000;
      auVar258._28_4_ = 0x7f800000;
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
      auVar241 = ZEXT3264(auVar111);
    }
    else {
      auVar13 = vsqrtps_avx(auVar181);
      auVar165 = vcmpps_avx(auVar181,auVar165,5);
      auVar181 = vrcpps_avx(local_360);
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = 0x3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar221._16_4_ = 0x3f800000;
      auVar221._20_4_ = 0x3f800000;
      auVar221._24_4_ = 0x3f800000;
      auVar221._28_4_ = 0x3f800000;
      auVar81 = vfnmadd213ps_fma(auVar181,local_360,auVar221);
      auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar181,auVar181);
      uVar1 = CONCAT44(local_340._4_4_,local_340._0_4_);
      auVar265._0_8_ = uVar1 ^ 0x8000000080000000;
      auVar265._8_4_ = -local_340._8_4_;
      auVar265._12_4_ = -local_340._12_4_;
      auVar265._16_4_ = -local_340._16_4_;
      auVar265._20_4_ = -local_340._20_4_;
      auVar265._24_4_ = -local_340._24_4_;
      auVar265._28_4_ = -local_340._28_4_;
      auVar181 = vsubps_avx(auVar265,auVar13);
      auVar30._4_4_ = auVar181._4_4_ * auVar81._4_4_;
      auVar30._0_4_ = auVar181._0_4_ * auVar81._0_4_;
      auVar30._8_4_ = auVar181._8_4_ * auVar81._8_4_;
      auVar30._12_4_ = auVar181._12_4_ * auVar81._12_4_;
      auVar30._16_4_ = auVar181._16_4_ * 0.0;
      auVar30._20_4_ = auVar181._20_4_ * 0.0;
      auVar30._24_4_ = auVar181._24_4_ * 0.0;
      auVar30._28_4_ = auVar181._28_4_;
      auVar181 = vsubps_avx(auVar13,local_340);
      auVar247._0_4_ = auVar81._0_4_ * auVar181._0_4_;
      auVar247._4_4_ = auVar81._4_4_ * auVar181._4_4_;
      auVar247._8_4_ = auVar81._8_4_ * auVar181._8_4_;
      auVar247._12_4_ = auVar81._12_4_ * auVar181._12_4_;
      auVar247._16_4_ = auVar181._16_4_ * 0.0;
      auVar247._20_4_ = auVar181._20_4_ * 0.0;
      auVar247._24_4_ = auVar181._24_4_ * 0.0;
      auVar247._28_4_ = 0;
      auVar81 = vfmadd213ps_fma(auVar243,auVar30,auVar270);
      local_3e0 = ZEXT1632(CONCAT412(fVar126 * auVar81._12_4_,
                                     CONCAT48(fVar130 * auVar81._8_4_,
                                              CONCAT44(fVar125 * auVar81._4_4_,
                                                       fVar95 * auVar81._0_4_))));
      auVar181 = vandps_avx(local_320,local_660);
      auVar181 = vmaxps_avx(local_540,auVar181);
      auVar31._4_4_ = auVar181._4_4_ * 1.9073486e-06;
      auVar31._0_4_ = auVar181._0_4_ * 1.9073486e-06;
      auVar31._8_4_ = auVar181._8_4_ * 1.9073486e-06;
      auVar31._12_4_ = auVar181._12_4_ * 1.9073486e-06;
      auVar31._16_4_ = auVar181._16_4_ * 1.9073486e-06;
      auVar31._20_4_ = auVar181._20_4_ * 1.9073486e-06;
      auVar31._24_4_ = auVar181._24_4_ * 1.9073486e-06;
      auVar31._28_4_ = auVar181._28_4_;
      auVar181 = vandps_avx(local_660,local_ac0);
      auVar181 = vcmpps_avx(auVar181,auVar31,1);
      auVar81 = vfmadd213ps_fma(auVar243,auVar247,auVar270);
      auVar222._8_4_ = 0x7f800000;
      auVar222._0_8_ = 0x7f8000007f800000;
      auVar222._12_4_ = 0x7f800000;
      auVar222._16_4_ = 0x7f800000;
      auVar222._20_4_ = 0x7f800000;
      auVar222._24_4_ = 0x7f800000;
      auVar222._28_4_ = 0x7f800000;
      auVar258 = vblendvps_avx(auVar222,auVar30,auVar165);
      local_400 = fVar95 * auVar81._0_4_;
      fStack_3fc = fVar125 * auVar81._4_4_;
      fStack_3f8 = fVar130 * auVar81._8_4_;
      fStack_3f4 = fVar126 * auVar81._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = auVar258._28_4_;
      auVar259._8_4_ = 0xff800000;
      auVar259._0_8_ = 0xff800000ff800000;
      auVar259._12_4_ = 0xff800000;
      auVar259._16_4_ = 0xff800000;
      auVar259._20_4_ = 0xff800000;
      auVar259._24_4_ = 0xff800000;
      auVar259._28_4_ = 0xff800000;
      auVar229 = vblendvps_avx(auVar259,auVar247,auVar165);
      auVar13 = auVar165 & auVar181;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar241 = ZEXT3264(auVar111);
      }
      else {
        auVar111 = vandps_avx(auVar181,auVar165);
        auVar14 = vcmpps_avx(auVar14,_DAT_01f7b000,2);
        auVar267._8_4_ = 0xff800000;
        auVar267._0_8_ = 0xff800000ff800000;
        auVar267._12_4_ = 0xff800000;
        auVar267._16_4_ = 0xff800000;
        auVar267._20_4_ = 0xff800000;
        auVar267._24_4_ = 0xff800000;
        auVar267._28_4_ = 0xff800000;
        auVar226._8_4_ = 0x7f800000;
        auVar226._0_8_ = 0x7f8000007f800000;
        auVar226._12_4_ = 0x7f800000;
        auVar226._16_4_ = 0x7f800000;
        auVar226._20_4_ = 0x7f800000;
        auVar226._24_4_ = 0x7f800000;
        auVar226._28_4_ = 0x7f800000;
        auVar181 = vblendvps_avx(auVar226,auVar267,auVar14);
        auVar81 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar13 = vpmovsxwd_avx2(auVar81);
        auVar258 = vblendvps_avx(auVar258,auVar181,auVar13);
        auVar181 = vblendvps_avx(auVar267,auVar226,auVar14);
        auVar229 = vblendvps_avx(auVar229,auVar181,auVar13);
        auVar140._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
        auVar140._8_4_ = auVar111._8_4_ ^ 0xffffffff;
        auVar140._12_4_ = auVar111._12_4_ ^ 0xffffffff;
        auVar140._16_4_ = auVar111._16_4_ ^ 0xffffffff;
        auVar140._20_4_ = auVar111._20_4_ ^ 0xffffffff;
        auVar140._24_4_ = auVar111._24_4_ ^ 0xffffffff;
        auVar140._28_4_ = auVar111._28_4_ ^ 0xffffffff;
        auVar111 = vorps_avx(auVar14,auVar140);
        auVar111 = vandps_avx(auVar165,auVar111);
        auVar241 = ZEXT3264(auVar111);
      }
    }
    auVar181 = auVar241._0_32_;
    auVar111 = local_500 & auVar181;
    fVar131 = (float)local_8c0._0_4_;
    fVar142 = (float)local_8c0._4_4_;
    fVar143 = fStack_8b8;
    fVar144 = fStack_8b4;
    fVar145 = fStack_8b0;
    fVar212 = fStack_8ac;
    fVar213 = fStack_8a8;
    fVar214 = fStack_8a4;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
LAB_0113f4d6:
      auVar248 = ZEXT3264(local_960);
      auVar236 = ZEXT3264(CONCAT824(uStack_888,CONCAT816(uStack_890,CONCAT88(uStack_898,local_8a0)))
                         );
      auVar210 = ZEXT3264(local_9e0);
      auVar261 = ZEXT3264(auVar257);
    }
    else {
      local_420 = ZEXT1632(auVar72);
      auVar236 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar215 = *(float *)(ray + k * 4 + 0x80) - (float)local_910._0_4_;
      auVar197._4_4_ = fVar215;
      auVar197._0_4_ = fVar215;
      auVar197._8_4_ = fVar215;
      auVar197._12_4_ = fVar215;
      auVar197._16_4_ = fVar215;
      auVar197._20_4_ = fVar215;
      auVar197._24_4_ = fVar215;
      auVar197._28_4_ = fVar215;
      auVar165 = vminps_avx(auVar197,auVar229);
      auVar32._4_4_ = fVar128 * auVar239._4_4_;
      auVar32._0_4_ = fVar127 * auVar239._0_4_;
      auVar32._8_4_ = fVar129 * auVar239._8_4_;
      auVar32._12_4_ = fVar201 * auVar239._12_4_;
      auVar32._16_4_ = fVar211 * auVar239._16_4_;
      auVar32._20_4_ = fVar146 * auVar239._20_4_;
      auVar32._24_4_ = fVar172 * auVar239._24_4_;
      auVar32._28_4_ = auVar207._28_4_;
      auVar72 = vfmadd213ps_fma(auVar167,local_aa0,auVar32);
      auVar55._4_4_ = fStack_3bc;
      auVar55._0_4_ = local_3c0;
      auVar55._8_4_ = fStack_3b8;
      auVar55._12_4_ = fStack_3b4;
      auVar55._16_4_ = fStack_3b0;
      auVar55._20_4_ = fStack_3ac;
      auVar55._24_4_ = fStack_3a8;
      auVar55._28_4_ = fStack_3a4;
      auVar207 = vmaxps_avx(auVar55,auVar258);
      auVar81 = vfmadd213ps_fma(auVar170,local_760,ZEXT1632(auVar72));
      auVar33._4_4_ = (float)local_880._4_4_ * auVar239._4_4_;
      auVar33._0_4_ = (float)local_880._0_4_ * auVar239._0_4_;
      auVar33._8_4_ = fStack_878 * auVar239._8_4_;
      auVar33._12_4_ = fStack_874 * auVar239._12_4_;
      auVar33._16_4_ = fStack_870 * auVar239._16_4_;
      auVar33._20_4_ = fStack_86c * auVar239._20_4_;
      auVar33._24_4_ = fStack_868 * auVar239._24_4_;
      auVar33._28_4_ = 0;
      auVar241 = ZEXT3264(_local_620);
      auVar72 = vfmadd231ps_fma(auVar33,_local_620,local_aa0);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar72),_local_640,local_760);
      auVar111 = vandps_avx(ZEXT1632(auVar97),local_660);
      auVar223._8_4_ = 0x219392ef;
      auVar223._0_8_ = 0x219392ef219392ef;
      auVar223._12_4_ = 0x219392ef;
      auVar223._16_4_ = 0x219392ef;
      auVar223._20_4_ = 0x219392ef;
      auVar223._24_4_ = 0x219392ef;
      auVar223._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar111,auVar223,1);
      auVar111 = vrcpps_avx(ZEXT1632(auVar97));
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = 0x3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar260._16_4_ = 0x3f800000;
      auVar260._20_4_ = 0x3f800000;
      auVar260._24_4_ = 0x3f800000;
      auVar260._28_4_ = 0x3f800000;
      auVar167 = ZEXT1632(auVar97);
      auVar72 = vfnmadd213ps_fma(auVar111,auVar167,auVar260);
      auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar111,auVar111);
      auVar206._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
      auVar206._8_4_ = auVar97._8_4_ ^ 0x80000000;
      auVar206._12_4_ = auVar97._12_4_ ^ 0x80000000;
      auVar206._16_4_ = 0x80000000;
      auVar206._20_4_ = 0x80000000;
      auVar206._24_4_ = 0x80000000;
      auVar206._28_4_ = 0x80000000;
      auVar34._4_4_ = auVar72._4_4_ * -auVar81._4_4_;
      auVar34._0_4_ = auVar72._0_4_ * -auVar81._0_4_;
      auVar34._8_4_ = auVar72._8_4_ * -auVar81._8_4_;
      auVar34._12_4_ = auVar72._12_4_ * -auVar81._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar111 = vcmpps_avx(auVar167,auVar206,1);
      auVar111 = vorps_avx(auVar111,auVar14);
      auVar266._8_4_ = 0xff800000;
      auVar266._0_8_ = 0xff800000ff800000;
      auVar266._12_4_ = 0xff800000;
      auVar266._16_4_ = 0xff800000;
      auVar266._20_4_ = 0xff800000;
      auVar266._24_4_ = 0xff800000;
      auVar266._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar34,auVar266,auVar111);
      auVar207 = vmaxps_avx(auVar207,auVar111);
      auVar111 = vcmpps_avx(auVar167,auVar206,6);
      auVar111 = vorps_avx(auVar14,auVar111);
      auVar182._8_4_ = 0x7f800000;
      auVar182._0_8_ = 0x7f8000007f800000;
      auVar182._12_4_ = 0x7f800000;
      auVar182._16_4_ = 0x7f800000;
      auVar182._20_4_ = 0x7f800000;
      auVar182._24_4_ = 0x7f800000;
      auVar182._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar34,auVar182,auVar111);
      auVar167 = vminps_avx(auVar165,auVar111);
      fVar146 = -local_a00._0_4_;
      fVar172 = -local_a00._4_4_;
      fVar127 = -local_a00._8_4_;
      fVar128 = -local_a00._12_4_;
      fVar129 = -local_a00._16_4_;
      fVar201 = -local_a00._20_4_;
      fVar211 = -local_a00._24_4_;
      auVar183._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
      auVar183._8_4_ = -local_a20._8_4_;
      auVar183._12_4_ = -local_a20._12_4_;
      auVar183._16_4_ = -local_a20._16_4_;
      auVar183._20_4_ = -local_a20._20_4_;
      auVar183._24_4_ = -local_a20._24_4_;
      auVar183._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,_local_940);
      auVar14 = vsubps_avx(ZEXT832(0) << 0x20,local_a80);
      auVar35._4_4_ = auVar14._4_4_ * fVar172;
      auVar35._0_4_ = auVar14._0_4_ * fVar146;
      auVar35._8_4_ = auVar14._8_4_ * fVar127;
      auVar35._12_4_ = auVar14._12_4_ * fVar128;
      auVar35._16_4_ = auVar14._16_4_ * fVar129;
      auVar35._20_4_ = auVar14._20_4_ * fVar201;
      auVar35._24_4_ = auVar14._24_4_ * fVar211;
      auVar35._28_4_ = auVar14._28_4_;
      auVar72 = vfmadd231ps_fma(auVar35,auVar183,auVar111);
      auVar198._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
      auVar198._8_4_ = -local_9c0._8_4_;
      auVar198._12_4_ = -local_9c0._12_4_;
      auVar198._16_4_ = -local_9c0._16_4_;
      auVar198._20_4_ = -local_9c0._20_4_;
      auVar198._24_4_ = -local_9c0._24_4_;
      auVar198._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar111 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar198,auVar111);
      auVar36._4_4_ = (float)local_880._4_4_ * fVar172;
      auVar36._0_4_ = (float)local_880._0_4_ * fVar146;
      auVar36._8_4_ = fStack_878 * fVar127;
      auVar36._12_4_ = fStack_874 * fVar128;
      auVar36._16_4_ = fStack_870 * fVar129;
      auVar36._20_4_ = fStack_86c * fVar201;
      auVar36._24_4_ = fStack_868 * fVar211;
      auVar36._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar72 = vfmadd231ps_fma(auVar36,_local_620,auVar183);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar72),_local_640,auVar198);
      auVar111 = vandps_avx(ZEXT1632(auVar97),local_660);
      auVar170 = vrcpps_avx(ZEXT1632(auVar97));
      auVar114._8_4_ = 0x219392ef;
      auVar114._0_8_ = 0x219392ef219392ef;
      auVar114._12_4_ = 0x219392ef;
      auVar114._16_4_ = 0x219392ef;
      auVar114._20_4_ = 0x219392ef;
      auVar114._24_4_ = 0x219392ef;
      auVar114._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar111,auVar114,1);
      auVar165 = ZEXT1632(auVar97);
      auVar72 = vfnmadd213ps_fma(auVar170,auVar165,auVar260);
      auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar170,auVar170);
      auVar199._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
      auVar199._8_4_ = auVar97._8_4_ ^ 0x80000000;
      auVar199._12_4_ = auVar97._12_4_ ^ 0x80000000;
      auVar199._16_4_ = 0x80000000;
      auVar199._20_4_ = 0x80000000;
      auVar199._24_4_ = 0x80000000;
      auVar199._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar72._4_4_ * -auVar81._4_4_;
      auVar37._0_4_ = auVar72._0_4_ * -auVar81._0_4_;
      auVar37._8_4_ = auVar72._8_4_ * -auVar81._8_4_;
      auVar37._12_4_ = auVar72._12_4_ * -auVar81._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar111 = vcmpps_avx(auVar165,auVar199,1);
      auVar111 = vorps_avx(auVar111,auVar14);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar37,auVar115,auVar111);
      local_a40 = vmaxps_avx(auVar207,auVar111);
      auVar111 = vcmpps_avx(auVar165,auVar199,6);
      auVar111 = vorps_avx(auVar14,auVar111);
      auVar136._8_4_ = 0x7f800000;
      auVar136._0_8_ = 0x7f8000007f800000;
      auVar136._12_4_ = 0x7f800000;
      auVar136._16_4_ = 0x7f800000;
      auVar136._20_4_ = 0x7f800000;
      auVar136._24_4_ = 0x7f800000;
      auVar136._28_4_ = 0x7f800000;
      auVar14 = vblendvps_avx(auVar37,auVar136,auVar111);
      auVar111 = vandps_avx(auVar181,local_500);
      local_440 = vminps_avx(auVar167,auVar14);
      auVar181 = vcmpps_avx(local_a40,local_440,2);
      auVar14 = auVar111 & auVar181;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar14 >> 0x7f,0) == '\0') &&
            (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar14 >> 0xbf,0) == '\0') &&
          (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar14[0x1f])
      goto LAB_0113f4d6;
      auVar208._8_4_ = 0x3f800000;
      auVar208._0_8_ = 0x3f8000003f800000;
      auVar208._12_4_ = 0x3f800000;
      auVar208._16_4_ = 0x3f800000;
      auVar208._20_4_ = 0x3f800000;
      auVar208._24_4_ = 0x3f800000;
      auVar208._28_4_ = 0x3f800000;
      auVar14 = vminps_avx(local_3e0,auVar208);
      auVar167 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar14 = vmaxps_avx(auVar14,ZEXT832(0) << 0x20);
      auVar54._4_4_ = fStack_3fc;
      auVar54._0_4_ = local_400;
      auVar54._8_4_ = fStack_3f8;
      auVar54._12_4_ = fStack_3f4;
      auVar54._16_4_ = uStack_3f0;
      auVar54._20_4_ = uStack_3ec;
      auVar54._24_4_ = uStack_3e8;
      auVar54._28_4_ = uStack_3e4;
      auVar207 = vminps_avx(auVar54,auVar208);
      auVar207 = vmaxps_avx(auVar207,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar14._28_4_ + 7.0;
      auVar72 = vfmadd213ps_fma(auVar38,local_7a0,local_780);
      auVar39._4_4_ = (auVar207._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar207._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar207._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar207._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar207._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar207._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar207._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar207._28_4_ + 7.0;
      auVar81 = vfmadd213ps_fma(auVar39,local_7a0,local_780);
      auVar14 = vminps_avx(local_7c0,local_7e0);
      auVar207 = vminps_avx(auVar230,auVar209);
      auVar14 = vminps_avx(auVar14,auVar207);
      auVar14 = vsubps_avx(auVar14,local_5a0);
      auVar111 = vandps_avx(auVar181,auVar111);
      local_1a0 = ZEXT1632(auVar72);
      local_1c0 = ZEXT1632(auVar81);
      auVar40._4_4_ = auVar14._4_4_ * 0.99999976;
      auVar40._0_4_ = auVar14._0_4_ * 0.99999976;
      auVar40._8_4_ = auVar14._8_4_ * 0.99999976;
      auVar40._12_4_ = auVar14._12_4_ * 0.99999976;
      auVar40._16_4_ = auVar14._16_4_ * 0.99999976;
      auVar40._20_4_ = auVar14._20_4_ * 0.99999976;
      auVar40._24_4_ = auVar14._24_4_ * 0.99999976;
      auVar40._28_4_ = auVar181._28_4_;
      auVar181 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
      auVar41._4_4_ = auVar181._4_4_ * auVar181._4_4_;
      auVar41._0_4_ = auVar181._0_4_ * auVar181._0_4_;
      auVar41._8_4_ = auVar181._8_4_ * auVar181._8_4_;
      auVar41._12_4_ = auVar181._12_4_ * auVar181._12_4_;
      auVar41._16_4_ = auVar181._16_4_ * auVar181._16_4_;
      auVar41._20_4_ = auVar181._20_4_ * auVar181._20_4_;
      auVar41._24_4_ = auVar181._24_4_ * auVar181._24_4_;
      auVar41._28_4_ = auVar181._28_4_;
      auVar14 = vsubps_avx(auVar184,auVar41);
      auVar42._4_4_ = auVar14._4_4_ * (float)local_5c0._4_4_;
      auVar42._0_4_ = auVar14._0_4_ * (float)local_5c0._0_4_;
      auVar42._8_4_ = auVar14._8_4_ * fStack_5b8;
      auVar42._12_4_ = auVar14._12_4_ * fStack_5b4;
      auVar42._16_4_ = auVar14._16_4_ * fStack_5b0;
      auVar42._20_4_ = auVar14._20_4_ * fStack_5ac;
      auVar42._24_4_ = auVar14._24_4_ * fStack_5a8;
      auVar42._28_4_ = auVar181._28_4_;
      auVar207 = vsubps_avx(auVar28,auVar42);
      local_9a0 = vcmpps_avx(auVar207,ZEXT832(0) << 0x20,5);
      auVar181 = local_9a0;
      if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0x7f,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9a0 >> 0xbf,0) == '\0') &&
          (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9a0[0x1f]) {
        auVar209 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar195 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar184 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar230 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar224._8_4_ = 0x7f800000;
        auVar224._0_8_ = 0x7f8000007f800000;
        auVar224._12_4_ = 0x7f800000;
        auVar224._16_4_ = 0x7f800000;
        auVar224._20_4_ = 0x7f800000;
        auVar224._24_4_ = 0x7f800000;
        auVar224._28_4_ = 0x7f800000;
        auVar244._8_4_ = 0xff800000;
        auVar244._0_8_ = 0xff800000ff800000;
        auVar244._12_4_ = 0xff800000;
        auVar244._16_4_ = 0xff800000;
        auVar244._20_4_ = 0xff800000;
        auVar244._24_4_ = 0xff800000;
        auVar244._28_4_ = 0xff800000;
        local_9a0 = auVar15;
      }
      else {
        auVar167 = vrcpps_avx(local_360);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        auVar72 = vfnmadd213ps_fma(local_360,auVar167,auVar168);
        auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar167,auVar167);
        auVar167 = vsqrtps_avx(auVar207);
        uVar1 = CONCAT44(local_340._4_4_,local_340._0_4_);
        auVar169._0_8_ = uVar1 ^ 0x8000000080000000;
        auVar169._8_4_ = -local_340._8_4_;
        auVar169._12_4_ = -local_340._12_4_;
        auVar169._16_4_ = -local_340._16_4_;
        auVar169._20_4_ = -local_340._20_4_;
        auVar169._24_4_ = -local_340._24_4_;
        auVar169._28_4_ = -local_340._28_4_;
        auVar170 = vsubps_avx(auVar169,auVar167);
        auVar184 = vsubps_avx(auVar167,local_340);
        fVar146 = auVar170._0_4_ * auVar72._0_4_;
        fVar172 = auVar170._4_4_ * auVar72._4_4_;
        auVar43._4_4_ = fVar172;
        auVar43._0_4_ = fVar146;
        fVar127 = auVar170._8_4_ * auVar72._8_4_;
        auVar43._8_4_ = fVar127;
        fVar128 = auVar170._12_4_ * auVar72._12_4_;
        auVar43._12_4_ = fVar128;
        fVar129 = auVar170._16_4_ * 0.0;
        auVar43._16_4_ = fVar129;
        fVar201 = auVar170._20_4_ * 0.0;
        auVar43._20_4_ = fVar201;
        fVar211 = auVar170._24_4_ * 0.0;
        auVar43._24_4_ = fVar211;
        auVar43._28_4_ = auVar167._28_4_;
        fVar215 = auVar184._0_4_ * auVar72._0_4_;
        fVar216 = auVar184._4_4_ * auVar72._4_4_;
        auVar44._4_4_ = fVar216;
        auVar44._0_4_ = fVar215;
        fVar249 = auVar184._8_4_ * auVar72._8_4_;
        auVar44._8_4_ = fVar249;
        fVar250 = auVar184._12_4_ * auVar72._12_4_;
        auVar44._12_4_ = fVar250;
        fVar251 = auVar184._16_4_ * 0.0;
        auVar44._16_4_ = fVar251;
        fVar253 = auVar184._20_4_ * 0.0;
        auVar44._20_4_ = fVar253;
        fVar255 = auVar184._24_4_ * 0.0;
        auVar44._24_4_ = fVar255;
        auVar44._28_4_ = local_780._0_4_;
        auVar72 = vfmadd213ps_fma(auVar243,auVar43,auVar270);
        auVar81 = vfmadd213ps_fma(auVar243,auVar44,auVar270);
        auVar170 = ZEXT1632(CONCAT412(fVar126 * auVar72._12_4_,
                                      CONCAT48(fVar130 * auVar72._8_4_,
                                               CONCAT44(fVar125 * auVar72._4_4_,
                                                        fVar95 * auVar72._0_4_))));
        auVar167 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar126,
                                      CONCAT48(auVar81._8_4_ * fVar130,
                                               CONCAT44(auVar81._4_4_ * fVar125,
                                                        auVar81._0_4_ * fVar95))));
        auVar72 = vfmadd213ps_fma(local_2e0,auVar170,auVar163);
        auVar81 = vfmadd213ps_fma(local_2e0,auVar167,auVar163);
        auVar97 = vfmadd213ps_fma(local_300,auVar170,local_600);
        auVar76 = vfmadd213ps_fma(local_300,auVar167,local_600);
        auVar98 = vfmadd213ps_fma(auVar170,local_2c0,local_5e0);
        auVar147 = vfmadd213ps_fma(local_2c0,auVar167,local_5e0);
        auVar45._4_4_ = (float)local_640._4_4_ * fVar172;
        auVar45._0_4_ = (float)local_640._0_4_ * fVar146;
        auVar45._8_4_ = fStack_638 * fVar127;
        auVar45._12_4_ = fStack_634 * fVar128;
        auVar45._16_4_ = fStack_630 * fVar129;
        auVar45._20_4_ = fStack_62c * fVar201;
        auVar45._24_4_ = fStack_628 * fVar211;
        auVar45._28_4_ = 0;
        auVar184 = vsubps_avx(auVar45,ZEXT1632(auVar72));
        auVar200._0_4_ = (float)local_620._0_4_ * fVar146;
        auVar200._4_4_ = (float)local_620._4_4_ * fVar172;
        auVar200._8_4_ = fStack_618 * fVar127;
        auVar200._12_4_ = fStack_614 * fVar128;
        auVar200._16_4_ = fStack_610 * fVar129;
        auVar200._20_4_ = fStack_60c * fVar201;
        auVar200._24_4_ = fStack_608 * fVar211;
        auVar200._28_4_ = 0;
        auVar230 = vsubps_avx(auVar200,ZEXT1632(auVar97));
        auVar46._4_4_ = (float)local_880._4_4_ * fVar172;
        auVar46._0_4_ = (float)local_880._0_4_ * fVar146;
        auVar46._8_4_ = fStack_878 * fVar127;
        auVar46._12_4_ = fStack_874 * fVar128;
        auVar46._16_4_ = fStack_870 * fVar129;
        auVar46._20_4_ = fStack_86c * fVar201;
        auVar46._24_4_ = fStack_868 * fVar211;
        auVar46._28_4_ = 0;
        auVar167 = vsubps_avx(auVar46,ZEXT1632(auVar98));
        _local_c00 = auVar167._0_28_;
        auVar47._4_4_ = fVar216 * (float)local_640._4_4_;
        auVar47._0_4_ = fVar215 * (float)local_640._0_4_;
        auVar47._8_4_ = fVar249 * fStack_638;
        auVar47._12_4_ = fVar250 * fStack_634;
        auVar47._16_4_ = fVar251 * fStack_630;
        auVar47._20_4_ = fVar253 * fStack_62c;
        auVar47._24_4_ = fVar255 * fStack_628;
        auVar47._28_4_ = auVar167._28_4_;
        auVar167 = vsubps_avx(auVar47,ZEXT1632(auVar81));
        auVar48._4_4_ = (float)local_620._4_4_ * fVar216;
        auVar48._0_4_ = (float)local_620._0_4_ * fVar215;
        auVar48._8_4_ = fStack_618 * fVar249;
        auVar48._12_4_ = fStack_614 * fVar250;
        auVar48._16_4_ = fStack_610 * fVar251;
        auVar48._20_4_ = fStack_60c * fVar253;
        auVar48._24_4_ = fStack_608 * fVar255;
        auVar48._28_4_ = 0;
        auVar209 = vsubps_avx(auVar48,ZEXT1632(auVar76));
        auVar49._4_4_ = (float)local_880._4_4_ * fVar216;
        auVar49._0_4_ = (float)local_880._0_4_ * fVar215;
        auVar49._8_4_ = fStack_878 * fVar249;
        auVar49._12_4_ = fStack_874 * fVar250;
        auVar49._16_4_ = fStack_870 * fVar251;
        auVar49._20_4_ = fStack_86c * fVar253;
        auVar49._24_4_ = fStack_868 * fVar255;
        auVar49._28_4_ = 0;
        auVar170 = vsubps_avx(auVar49,ZEXT1632(auVar147));
        auVar195 = auVar170._0_28_;
        auVar170 = vcmpps_avx(auVar207,_DAT_01f7b000,5);
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar224 = vblendvps_avx(auVar225,auVar43,auVar170);
        auVar207 = vandps_avx(local_660,local_320);
        auVar207 = vmaxps_avx(local_540,auVar207);
        auVar50._4_4_ = auVar207._4_4_ * 1.9073486e-06;
        auVar50._0_4_ = auVar207._0_4_ * 1.9073486e-06;
        auVar50._8_4_ = auVar207._8_4_ * 1.9073486e-06;
        auVar50._12_4_ = auVar207._12_4_ * 1.9073486e-06;
        auVar50._16_4_ = auVar207._16_4_ * 1.9073486e-06;
        auVar50._20_4_ = auVar207._20_4_ * 1.9073486e-06;
        auVar50._24_4_ = auVar207._24_4_ * 1.9073486e-06;
        auVar50._28_4_ = auVar207._28_4_;
        auVar207 = vandps_avx(local_660,local_ac0);
        auVar207 = vcmpps_avx(auVar207,auVar50,1);
        auVar245._8_4_ = 0xff800000;
        auVar245._0_8_ = 0xff800000ff800000;
        auVar245._12_4_ = 0xff800000;
        auVar245._16_4_ = 0xff800000;
        auVar245._20_4_ = 0xff800000;
        auVar245._24_4_ = 0xff800000;
        auVar245._28_4_ = 0xff800000;
        auVar244 = vblendvps_avx(auVar245,auVar44,auVar170);
        auVar15 = auVar170 & auVar207;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar181 = vandps_avx(auVar170,auVar207);
          auVar207 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,2);
          auVar240._8_4_ = 0xff800000;
          auVar240._0_8_ = 0xff800000ff800000;
          auVar240._12_4_ = 0xff800000;
          auVar240._16_4_ = 0xff800000;
          auVar240._20_4_ = 0xff800000;
          auVar240._24_4_ = 0xff800000;
          auVar240._28_4_ = 0xff800000;
          auVar123._8_4_ = 0x7f800000;
          auVar123._0_8_ = 0x7f8000007f800000;
          auVar123._12_4_ = 0x7f800000;
          auVar123._16_4_ = 0x7f800000;
          auVar123._20_4_ = 0x7f800000;
          auVar123._24_4_ = 0x7f800000;
          auVar123._28_4_ = 0x7f800000;
          auVar14 = vblendvps_avx(auVar123,auVar240,auVar207);
          auVar72 = vpackssdw_avx(auVar181._0_16_,auVar181._16_16_);
          auVar15 = vpmovsxwd_avx2(auVar72);
          auVar224 = vblendvps_avx(auVar224,auVar14,auVar15);
          auVar14 = vblendvps_avx(auVar240,auVar123,auVar207);
          auVar244 = vblendvps_avx(auVar244,auVar14,auVar15);
          auVar141._0_8_ = auVar181._0_8_ ^ 0xffffffffffffffff;
          auVar141._8_4_ = auVar181._8_4_ ^ 0xffffffff;
          auVar141._12_4_ = auVar181._12_4_ ^ 0xffffffff;
          auVar141._16_4_ = auVar181._16_4_ ^ 0xffffffff;
          auVar141._20_4_ = auVar181._20_4_ ^ 0xffffffff;
          auVar141._24_4_ = auVar181._24_4_ ^ 0xffffffff;
          auVar141._28_4_ = auVar181._28_4_ ^ 0xffffffff;
          auVar181 = vorps_avx(auVar207,auVar141);
          auVar181 = vandps_avx(auVar170,auVar181);
        }
      }
      auVar241 = ZEXT3264(auVar181);
      auVar261 = ZEXT3264(auVar257);
      local_4a0 = local_a40;
      local_480 = vminps_avx(local_440,auVar224);
      _local_800 = vmaxps_avx(local_a40,auVar244);
      _local_460 = _local_800;
      auVar14 = vcmpps_avx(local_a40,local_480,2);
      local_5a0 = vandps_avx(auVar14,auVar111);
      auVar14 = vcmpps_avx(_local_800,local_440,2);
      local_820 = vandps_avx(auVar14,auVar111);
      auVar246 = ZEXT3264(local_820);
      auVar111 = vorps_avx(local_820,local_5a0);
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0x7f,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0xbf,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar111[0x1f]) {
        auVar2._8_8_ = uStack_898;
        auVar2._0_8_ = local_8a0;
        auVar2._16_8_ = uStack_890;
        auVar2._24_8_ = uStack_888;
        auVar210 = ZEXT3264(local_9e0);
      }
      else {
        auStack_8d8 = auVar28._8_24_;
        auVar51._4_4_ = (float)local_880._4_4_ * auVar195._4_4_;
        auVar51._0_4_ = (float)local_880._0_4_ * auVar195._0_4_;
        auVar51._8_4_ = fStack_878 * auVar195._8_4_;
        auVar51._12_4_ = fStack_874 * auVar195._12_4_;
        auVar51._16_4_ = fStack_870 * auVar195._16_4_;
        auVar51._20_4_ = fStack_86c * auVar195._20_4_;
        auVar51._24_4_ = fStack_868 * auVar195._24_4_;
        auVar51._28_4_ = auVar111._28_4_;
        auVar72 = vfmadd213ps_fma(auVar209,_local_620,auVar51);
        auVar72 = vfmadd213ps_fma(auVar167,_local_640,ZEXT1632(auVar72));
        auVar88._0_8_ = auVar181._0_8_ ^ 0xffffffffffffffff;
        auVar88._8_4_ = auVar181._8_4_ ^ 0xffffffff;
        auVar88._12_4_ = auVar181._12_4_ ^ 0xffffffff;
        auVar88._16_4_ = auVar181._16_4_ ^ 0xffffffff;
        auVar88._20_4_ = auVar181._20_4_ ^ 0xffffffff;
        auVar88._24_4_ = auVar181._24_4_ ^ 0xffffffff;
        auVar88._28_4_ = auVar181._28_4_ ^ 0xffffffff;
        auVar246 = ZEXT3264(local_660);
        auVar111 = vandps_avx(local_660,ZEXT1632(auVar72));
        auVar138._8_4_ = 0x3e99999a;
        auVar138._0_8_ = 0x3e99999a3e99999a;
        auVar138._12_4_ = 0x3e99999a;
        auVar138._16_4_ = 0x3e99999a;
        auVar138._20_4_ = 0x3e99999a;
        auVar138._24_4_ = 0x3e99999a;
        auVar138._28_4_ = 0x3e99999a;
        auVar111 = vcmpps_avx(auVar111,auVar138,1);
        local_5e0 = vorps_avx(auVar111,auVar88);
        auVar52._4_4_ = (float)local_880._4_4_ * (float)local_c00._4_4_;
        auVar52._0_4_ = (float)local_880._0_4_ * (float)local_c00._0_4_;
        auVar52._8_4_ = fStack_878 * fStack_bf8;
        auVar52._12_4_ = fStack_874 * fStack_bf4;
        auVar52._16_4_ = fStack_870 * fStack_bf0;
        auVar52._20_4_ = fStack_86c * fStack_bec;
        auVar52._24_4_ = fStack_868 * fStack_be8;
        auVar52._28_4_ = local_5e0._28_4_;
        auVar72 = vfmadd213ps_fma(auVar230,_local_620,auVar52);
        auVar72 = vfmadd213ps_fma(auVar184,_local_640,ZEXT1632(auVar72));
        auVar111 = vandps_avx(local_660,ZEXT1632(auVar72));
        auVar111 = vcmpps_avx(auVar111,auVar138,1);
        auVar111 = vorps_avx(auVar111,auVar88);
        auVar117._8_4_ = 3;
        auVar117._0_8_ = 0x300000003;
        auVar117._12_4_ = 3;
        auVar117._16_4_ = 3;
        auVar117._20_4_ = 3;
        auVar117._24_4_ = 3;
        auVar117._28_4_ = 3;
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar111 = vblendvps_avx(auVar139,auVar117,auVar111);
        local_600._4_4_ = local_c44;
        local_600._0_4_ = local_c44;
        local_600._8_4_ = local_c44;
        local_600._12_4_ = local_c44;
        local_600._16_4_ = local_c44;
        local_600._20_4_ = local_c44;
        local_600._24_4_ = local_c44;
        local_600._28_4_ = local_c44;
        _local_5c0 = vpcmpgtd_avx2(auVar111,local_600);
        auVar111 = vpandn_avx2(_local_5c0,local_5a0);
        local_840._4_4_ = local_a40._4_4_ + (float)local_8c0._4_4_;
        local_840._0_4_ = local_a40._0_4_ + (float)local_8c0._0_4_;
        fStack_838 = local_a40._8_4_ + fStack_8b8;
        fStack_834 = local_a40._12_4_ + fStack_8b4;
        fStack_830 = local_a40._16_4_ + fStack_8b0;
        fStack_82c = local_a40._20_4_ + fStack_8ac;
        fStack_828 = local_a40._24_4_ + fStack_8a8;
        fStack_824 = local_a40._28_4_ + fStack_8a4;
        while( true ) {
          local_4c0 = auVar111;
          fStack_b2c = auVar73._4_4_;
          fStack_b28 = auVar73._8_4_;
          fStack_b24 = auVar73._12_4_;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) break;
          auVar118._8_4_ = 0x7f800000;
          auVar118._0_8_ = 0x7f8000007f800000;
          auVar118._12_4_ = 0x7f800000;
          auVar118._16_4_ = 0x7f800000;
          auVar118._20_4_ = 0x7f800000;
          auVar118._24_4_ = 0x7f800000;
          auVar118._28_4_ = 0x7f800000;
          auVar181 = vblendvps_avx(auVar118,local_a40,auVar111);
          auVar14 = vshufps_avx(auVar181,auVar181,0xb1);
          auVar14 = vminps_avx(auVar181,auVar14);
          auVar207 = vshufpd_avx(auVar14,auVar14,5);
          auVar14 = vminps_avx(auVar14,auVar207);
          auVar207 = vpermpd_avx2(auVar14,0x4e);
          auVar14 = vminps_avx(auVar14,auVar207);
          auVar181 = vcmpps_avx(auVar181,auVar14,0);
          auVar14 = auVar111 & auVar181;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar181,auVar111);
          }
          uVar61 = vmovmskps_avx(auVar111);
          iVar16 = 0;
          for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
            iVar16 = iVar16 + 1;
          }
          uVar65 = iVar16 << 2;
          *(undefined4 *)(local_4c0 + uVar65) = 0;
          uVar61 = *(uint *)(local_1a0 + uVar65);
          uVar65 = *(uint *)(local_4a0 + uVar65);
          fVar131 = auVar7._0_4_;
          auVar111 = auVar261._0_32_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar241 = ZEXT1664(auVar241._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar131 = sqrtf((float)local_980._0_4_);
            auVar111 = auVar257;
          }
          auVar248 = ZEXT3264(auVar111);
          auVar81 = vminps_avx(auVar10,auVar12);
          auVar72 = vmaxps_avx(auVar10,auVar12);
          auVar97 = vminps_avx(auVar11,auVar73);
          auVar76 = vminps_avx(auVar81,auVar97);
          auVar81 = vmaxps_avx(auVar11,auVar73);
          auVar97 = vmaxps_avx(auVar72,auVar81);
          auVar72 = vandps_avx(auVar76,auVar227);
          auVar81 = vandps_avx(auVar97,auVar227);
          auVar72 = vmaxps_avx(auVar72,auVar81);
          auVar81 = vmovshdup_avx(auVar72);
          auVar81 = vmaxss_avx(auVar81,auVar72);
          auVar72 = vshufpd_avx(auVar72,auVar72,1);
          auVar72 = vmaxss_avx(auVar72,auVar81);
          local_9a0._0_4_ = auVar72._0_4_ * 1.9073486e-06;
          local_9c0._0_4_ = fVar131 * 1.9073486e-06;
          local_7e0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
          auVar72 = vinsertps_avx(ZEXT416(uVar65),ZEXT416(uVar61),0x10);
          auVar236 = ZEXT1664(auVar72);
          lVar64 = 5;
          do {
            do {
              bVar68 = lVar64 == 0;
              lVar64 = lVar64 + -1;
              auVar181 = auVar248._0_32_;
              if (bVar68) goto LAB_01140248;
              auVar98 = auVar236._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar98);
              fVar143 = 1.0 - local_a80._0_4_;
              auVar72 = vshufps_avx(auVar98,auVar98,0x55);
              fVar131 = auVar72._0_4_;
              auVar99._0_4_ = fVar93 * fVar131;
              fVar95 = auVar72._4_4_;
              auVar99._4_4_ = auVar12._4_4_ * fVar95;
              fVar142 = auVar72._8_4_;
              auVar99._8_4_ = auVar12._8_4_ * fVar142;
              fVar125 = auVar72._12_4_;
              auVar99._12_4_ = auVar12._12_4_ * fVar125;
              auVar132._4_4_ = fVar143;
              auVar132._0_4_ = fVar143;
              auVar132._8_4_ = fVar143;
              auVar132._12_4_ = fVar143;
              auVar72 = vfmadd231ps_fma(auVar99,auVar132,auVar10);
              auVar148._0_4_ = fVar94 * fVar131;
              auVar148._4_4_ = auVar11._4_4_ * fVar95;
              auVar148._8_4_ = auVar11._8_4_ * fVar142;
              auVar148._12_4_ = auVar11._12_4_ * fVar125;
              auVar81 = vfmadd231ps_fma(auVar148,auVar132,auVar12);
              auVar191._0_4_ = fVar131 * auVar81._0_4_;
              auVar191._4_4_ = fVar95 * auVar81._4_4_;
              auVar191._8_4_ = fVar142 * auVar81._8_4_;
              auVar191._12_4_ = fVar125 * auVar81._12_4_;
              auVar97 = vfmadd231ps_fma(auVar191,auVar132,auVar72);
              auVar100._0_4_ = fVar131 * fVar92;
              auVar100._4_4_ = fVar95 * fStack_b2c;
              auVar100._8_4_ = fVar142 * fStack_b28;
              auVar100._12_4_ = fVar125 * fStack_b24;
              auVar72 = vfmadd231ps_fma(auVar100,auVar132,auVar11);
              auVar175._0_4_ = fVar131 * auVar72._0_4_;
              auVar175._4_4_ = fVar95 * auVar72._4_4_;
              auVar175._8_4_ = fVar142 * auVar72._8_4_;
              auVar175._12_4_ = fVar125 * auVar72._12_4_;
              auVar81 = vfmadd231ps_fma(auVar175,auVar132,auVar81);
              uVar66 = auVar236._0_4_;
              auVar101._4_4_ = uVar66;
              auVar101._0_4_ = uVar66;
              auVar101._8_4_ = uVar66;
              auVar101._12_4_ = uVar66;
              auVar72 = vfmadd213ps_fma(auVar101,local_970,_DAT_01f45a50);
              auVar75._0_4_ = fVar131 * auVar81._0_4_;
              auVar75._4_4_ = fVar95 * auVar81._4_4_;
              auVar75._8_4_ = fVar142 * auVar81._8_4_;
              auVar75._12_4_ = fVar125 * auVar81._12_4_;
              auVar76 = vfmadd231ps_fma(auVar75,auVar97,auVar132);
              local_760._0_16_ = auVar76;
              auVar72 = vsubps_avx(auVar72,auVar76);
              _local_940 = auVar72;
              auVar72 = vdpps_avx(auVar72,auVar72,0x7f);
              fVar131 = auVar72._0_4_;
              if (fVar131 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar143);
                local_a00._0_16_ = auVar81;
                auVar91._0_4_ = sqrtf(fVar131);
                auVar91._4_60_ = extraout_var;
                auVar236 = ZEXT1664(auVar98);
                auVar76 = auVar91._0_16_;
                auVar81 = local_a00._0_16_;
                auVar147 = local_aa0._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar72,auVar72);
                auVar147 = ZEXT416((uint)fVar143);
              }
              auVar81 = vsubps_avx(auVar81,auVar97);
              auVar219._0_4_ = auVar81._0_4_ * 3.0;
              auVar219._4_4_ = auVar81._4_4_ * 3.0;
              auVar219._8_4_ = auVar81._8_4_ * 3.0;
              auVar219._12_4_ = auVar81._12_4_ * 3.0;
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar147,local_a80._0_16_);
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar147);
              fVar95 = auVar147._0_4_ * 6.0;
              fVar142 = auVar81._0_4_ * 6.0;
              fVar125 = auVar97._0_4_ * 6.0;
              fVar143 = local_a80._0_4_ * 6.0;
              auVar149._0_4_ = fVar143 * fVar92;
              auVar149._4_4_ = fVar143 * fStack_b2c;
              auVar149._8_4_ = fVar143 * fStack_b28;
              auVar149._12_4_ = fVar143 * fStack_b24;
              auVar102._4_4_ = fVar125;
              auVar102._0_4_ = fVar125;
              auVar102._8_4_ = fVar125;
              auVar102._12_4_ = fVar125;
              auVar81 = vfmadd132ps_fma(auVar102,auVar149,auVar11);
              auVar150._4_4_ = fVar142;
              auVar150._0_4_ = fVar142;
              auVar150._8_4_ = fVar142;
              auVar150._12_4_ = fVar142;
              auVar81 = vfmadd132ps_fma(auVar150,auVar81,auVar12);
              auVar97 = vdpps_avx(auVar219,auVar219,0x7f);
              auVar103._4_4_ = fVar95;
              auVar103._0_4_ = fVar95;
              auVar103._8_4_ = fVar95;
              auVar103._12_4_ = fVar95;
              auVar174 = vfmadd132ps_fma(auVar103,auVar81,auVar10);
              auVar81 = vblendps_avx(auVar97,_DAT_01f45a50,0xe);
              auVar147 = vrsqrtss_avx(auVar81,auVar81);
              fVar125 = auVar97._0_4_;
              fVar95 = auVar147._0_4_;
              auVar147 = vdpps_avx(auVar219,auVar174,0x7f);
              fVar95 = fVar95 * 1.5 + fVar125 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar104._0_4_ = auVar174._0_4_ * fVar125;
              auVar104._4_4_ = auVar174._4_4_ * fVar125;
              auVar104._8_4_ = auVar174._8_4_ * fVar125;
              auVar104._12_4_ = auVar174._12_4_ * fVar125;
              fVar142 = auVar147._0_4_;
              auVar192._0_4_ = auVar219._0_4_ * fVar142;
              auVar192._4_4_ = auVar219._4_4_ * fVar142;
              auVar192._8_4_ = auVar219._8_4_ * fVar142;
              auVar192._12_4_ = auVar219._12_4_ * fVar142;
              auVar147 = vsubps_avx(auVar104,auVar192);
              auVar81 = vrcpss_avx(auVar81,auVar81);
              auVar174 = vfnmadd213ss_fma(auVar81,auVar97,ZEXT416(0x40000000));
              fVar142 = auVar81._0_4_ * auVar174._0_4_;
              auVar81 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar236._0_4_ * (float)local_9c0._0_4_)));
              auVar261 = ZEXT1664(auVar81);
              uVar1 = CONCAT44(auVar219._4_4_,auVar219._0_4_);
              auVar256._0_8_ = uVar1 ^ 0x8000000080000000;
              auVar256._8_4_ = -auVar219._8_4_;
              auVar256._12_4_ = -auVar219._12_4_;
              auVar151._0_4_ = fVar95 * auVar147._0_4_ * fVar142;
              auVar151._4_4_ = fVar95 * auVar147._4_4_ * fVar142;
              auVar151._8_4_ = fVar95 * auVar147._8_4_ * fVar142;
              auVar151._12_4_ = fVar95 * auVar147._12_4_ * fVar142;
              auVar204._0_4_ = auVar219._0_4_ * fVar95;
              auVar204._4_4_ = auVar219._4_4_ * fVar95;
              auVar204._8_4_ = auVar219._8_4_ * fVar95;
              auVar204._12_4_ = auVar219._12_4_ * fVar95;
              local_a80._0_16_ = auVar219;
              local_aa0._0_4_ = auVar81._0_4_;
              if (fVar125 < -fVar125) {
                local_a00._0_16_ = auVar256;
                local_a20._0_16_ = auVar204;
                local_ac0._0_16_ = auVar151;
                fVar95 = sqrtf(fVar125);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar261 = ZEXT464((uint)local_aa0._0_4_);
                auVar151 = local_ac0._0_16_;
                auVar204 = local_a20._0_16_;
                auVar256 = local_a00._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar97,auVar97);
                fVar95 = auVar81._0_4_;
              }
              auVar81 = vdpps_avx(_local_940,auVar204,0x7f);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar76,auVar261._0_16_);
              auVar97 = vdpps_avx(auVar256,auVar204,0x7f);
              auVar147 = vdpps_avx(_local_940,auVar151,0x7f);
              auVar174 = vdpps_avx(local_970,auVar204,0x7f);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(auVar76._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_9a0._0_4_ / fVar95)),auVar71);
              auVar241 = ZEXT1664(auVar71);
              fVar95 = auVar97._0_4_ + auVar147._0_4_;
              auVar77._0_4_ = auVar81._0_4_ * auVar81._0_4_;
              auVar77._4_4_ = auVar81._4_4_ * auVar81._4_4_;
              auVar77._8_4_ = auVar81._8_4_ * auVar81._8_4_;
              auVar77._12_4_ = auVar81._12_4_ * auVar81._12_4_;
              auVar97 = vdpps_avx(_local_940,auVar256,0x7f);
              auVar147 = vsubps_avx(auVar72,auVar77);
              auVar76 = vrsqrtss_avx(auVar147,auVar147);
              fVar125 = auVar147._0_4_;
              fVar142 = auVar76._0_4_;
              fVar142 = fVar142 * 1.5 + fVar125 * -0.5 * fVar142 * fVar142 * fVar142;
              auVar76 = vdpps_avx(_local_940,local_970,0x7f);
              auVar97 = vfnmadd231ss_fma(auVar97,auVar81,ZEXT416((uint)fVar95));
              auVar76 = vfnmadd231ss_fma(auVar76,auVar81,auVar174);
              if (fVar125 < 0.0) {
                local_a00._0_16_ = auVar81;
                local_a20._0_4_ = auVar71._0_4_;
                local_ac0._0_16_ = ZEXT416((uint)fVar95);
                local_780._0_16_ = auVar174;
                local_7a0._0_4_ = fVar142;
                local_7c0._0_16_ = auVar76;
                fVar125 = sqrtf(fVar125);
                auVar241 = ZEXT464((uint)local_a20._0_4_);
                auVar261 = ZEXT464((uint)local_aa0._0_4_);
                fVar142 = (float)local_7a0._0_4_;
                auVar76 = local_7c0._0_16_;
                auVar174 = local_780._0_16_;
                auVar81 = local_a00._0_16_;
                auVar147 = local_ac0._0_16_;
              }
              else {
                auVar147 = vsqrtss_avx(auVar147,auVar147);
                fVar125 = auVar147._0_4_;
                auVar147 = ZEXT416((uint)fVar95);
              }
              auVar246 = ZEXT1664(auVar81);
              auVar248 = ZEXT3264(auVar257);
              auVar71 = vpermilps_avx(local_760._0_16_,0xff);
              fVar125 = fVar125 - auVar71._0_4_;
              auVar71 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar97 = vfmsub213ss_fma(auVar97,ZEXT416((uint)fVar142),auVar71);
              auVar152._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
              auVar152._8_4_ = auVar174._8_4_ ^ 0x80000000;
              auVar152._12_4_ = auVar174._12_4_ ^ 0x80000000;
              auVar176._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar176._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar176._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar96 = ZEXT416((uint)(auVar76._0_4_ * fVar142));
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar174._0_4_)),auVar147,
                                        auVar96);
              auVar97 = vinsertps_avx(auVar176,auVar96,0x1c);
              uVar66 = auVar76._0_4_;
              auVar177._4_4_ = uVar66;
              auVar177._0_4_ = uVar66;
              auVar177._8_4_ = uVar66;
              auVar177._12_4_ = uVar66;
              auVar97 = vdivps_avx(auVar97,auVar177);
              auVar76 = vinsertps_avx(auVar147,auVar152,0x10);
              auVar76 = vdivps_avx(auVar76,auVar177);
              fVar95 = auVar81._0_4_;
              auVar133._0_4_ = fVar95 * auVar97._0_4_ + fVar125 * auVar76._0_4_;
              auVar133._4_4_ = fVar95 * auVar97._4_4_ + fVar125 * auVar76._4_4_;
              auVar133._8_4_ = fVar95 * auVar97._8_4_ + fVar125 * auVar76._8_4_;
              auVar133._12_4_ = fVar95 * auVar97._12_4_ + fVar125 * auVar76._12_4_;
              auVar76 = vsubps_avx(auVar98,auVar133);
              auVar236 = ZEXT1664(auVar76);
              auVar97 = vandps_avx(auVar81,auVar227);
            } while (auVar241._0_4_ <= auVar97._0_4_);
            auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + auVar241._0_4_)),
                                      local_7e0._0_16_,ZEXT416(0x36000000));
            auVar97 = vandps_avx(ZEXT416((uint)fVar125),auVar227);
          } while (auVar98._0_4_ <= auVar97._0_4_);
          fVar95 = auVar76._0_4_ + (float)local_910._0_4_;
          auVar97 = ZEXT416((uint)fVar95);
          auVar181 = auVar257;
          if ((fVar69 <= fVar95) && (fVar142 = *(float *)(ray + k * 4 + 0x80), fVar95 <= fVar142)) {
            auVar98 = vmovshdup_avx(auVar76);
            fVar125 = auVar98._0_4_;
            if ((0.0 <= fVar125) && (fVar125 <= 1.0)) {
              auVar72 = vrsqrtss_avx(auVar72,auVar72);
              fVar143 = auVar72._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar67].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar131 = fVar143 * 1.5 + fVar131 * -0.5 * fVar143 * fVar143 * fVar143;
                auVar153._0_4_ = fVar131 * (float)local_940._0_4_;
                auVar153._4_4_ = fVar131 * (float)local_940._4_4_;
                auVar153._8_4_ = fVar131 * fStack_938;
                auVar153._12_4_ = fVar131 * fStack_934;
                auVar174 = vfmadd213ps_fma(auVar71,auVar153,local_a80._0_16_);
                auVar72 = vshufps_avx(auVar153,auVar153,0xc9);
                auVar98 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                auVar154._0_4_ = auVar153._0_4_ * auVar98._0_4_;
                auVar154._4_4_ = auVar153._4_4_ * auVar98._4_4_;
                auVar154._8_4_ = auVar153._8_4_ * auVar98._8_4_;
                auVar154._12_4_ = auVar153._12_4_ * auVar98._12_4_;
                auVar147 = vfmsub231ps_fma(auVar154,local_a80._0_16_,auVar72);
                auVar72 = vshufps_avx(auVar147,auVar147,0xc9);
                auVar98 = vshufps_avx(auVar174,auVar174,0xc9);
                auVar147 = vshufps_avx(auVar147,auVar147,0xd2);
                auVar78._0_4_ = auVar174._0_4_ * auVar147._0_4_;
                auVar78._4_4_ = auVar174._4_4_ * auVar147._4_4_;
                auVar78._8_4_ = auVar174._8_4_ * auVar147._8_4_;
                auVar78._12_4_ = auVar174._12_4_ * auVar147._12_4_;
                auVar72 = vfmsub231ps_fma(auVar78,auVar72,auVar98);
                uVar66 = auVar72._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar95;
                  uVar4 = vextractps_avx(auVar72,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                  uVar4 = vextractps_avx(auVar72,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar66;
                  *(float *)(ray + k * 4 + 0xf0) = fVar125;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar67;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_6f0 = vshufps_avx(auVar76,auVar76,0x55);
                  auVar76 = vshufps_avx(auVar72,auVar72,0x55);
                  auStack_710 = vshufps_avx(auVar72,auVar72,0xaa);
                  local_720 = (RTCHitN  [16])auVar76;
                  local_700 = uVar66;
                  uStack_6fc = uVar66;
                  uStack_6f8 = uVar66;
                  uStack_6f4 = uVar66;
                  local_6e0 = ZEXT416(0) << 0x20;
                  local_6d0 = CONCAT44(uStack_73c,local_740);
                  uStack_6c8 = CONCAT44(uStack_734,uStack_738);
                  local_6c0._4_4_ = uStack_72c;
                  local_6c0._0_4_ = local_730;
                  local_6c0._8_4_ = uStack_728;
                  local_6c0._12_4_ = uStack_724;
                  vpcmpeqd_avx2(ZEXT1632(local_6c0),ZEXT1632(local_6c0));
                  uStack_6ac = context->user->instID[0];
                  local_6b0 = uStack_6ac;
                  uStack_6a8 = uStack_6ac;
                  uStack_6a4 = uStack_6ac;
                  uStack_6a0 = context->user->instPrimID[0];
                  uStack_69c = uStack_6a0;
                  uStack_698 = uStack_6a0;
                  uStack_694 = uStack_6a0;
                  *(float *)(ray + k * 4 + 0x80) = fVar95;
                  local_860._0_16_ = *local_a48;
                  local_af0.valid = (int *)local_860;
                  local_af0.geometryUserPtr = pGVar5->userPtr;
                  local_af0.context = context->user;
                  local_af0.hit = local_720;
                  local_af0.N = 4;
                  auVar72 = *local_a48;
                  local_af0.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar241 = ZEXT1664(auVar241._0_16_);
                    auVar246 = ZEXT1664(auVar81);
                    (*pGVar5->intersectionFilterN)(&local_af0);
                    auVar124._8_56_ = extraout_var_01;
                    auVar124._0_8_ = extraout_XMM1_Qa;
                    auVar97 = auVar124._0_16_;
                    auVar72 = local_860._0_16_;
                  }
                  if (auVar72 == (undefined1  [16])0x0) {
                    auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar72 = vpcmpeqd_avx(auVar97,auVar97);
                    auVar81 = auVar81 ^ auVar72;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    auVar97 = vpcmpeqd_avx(auVar76,auVar76);
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar241 = ZEXT1664(auVar241._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      (*p_Var6)(&local_af0);
                      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
                      auVar72 = local_860._0_16_;
                    }
                    auVar76 = vpcmpeqd_avx(auVar72,_DAT_01f45a50);
                    auVar81 = auVar76 ^ auVar97;
                    if (auVar72 != (undefined1  [16])0x0) {
                      auVar76 = auVar76 ^ auVar97;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])local_af0.hit);
                      *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar72;
                      auVar72 = vmaskmovps_avx(auVar76,*(undefined1 (*) [16])(local_af0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar72;
                    }
                  }
                  auVar79._8_8_ = 0x100000001;
                  auVar79._0_8_ = 0x100000001;
                  if ((auVar79 & auVar81) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar142;
                  }
                }
              }
            }
          }
LAB_01140248:
          uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar234._4_4_ = uVar66;
          auVar234._0_4_ = uVar66;
          auVar234._8_4_ = uVar66;
          auVar234._12_4_ = uVar66;
          auVar234._16_4_ = uVar66;
          auVar234._20_4_ = uVar66;
          auVar234._24_4_ = uVar66;
          auVar234._28_4_ = uVar66;
          auVar236 = ZEXT3264(auVar234);
          auVar111 = vcmpps_avx(_local_840,auVar234,2);
          auVar111 = vandps_avx(auVar111,local_4c0);
          auVar261 = ZEXT3264(auVar181);
        }
        auVar89._0_4_ = (float)local_8c0._0_4_ + (float)local_800._0_4_;
        auVar89._4_4_ = (float)local_8c0._4_4_ + (float)local_800._4_4_;
        auVar89._8_4_ = fStack_8b8 + fStack_7f8;
        auVar89._12_4_ = fStack_8b4 + fStack_7f4;
        auVar89._16_4_ = fStack_8b0 + fStack_7f0;
        auVar89._20_4_ = fStack_8ac + fStack_7ec;
        auVar89._24_4_ = fStack_8a8 + fStack_7e8;
        auVar89._28_4_ = fStack_8a4 + fStack_7e4;
        uVar66 = auVar236._0_4_;
        auVar119._4_4_ = uVar66;
        auVar119._0_4_ = uVar66;
        auVar119._8_4_ = uVar66;
        auVar119._12_4_ = uVar66;
        auVar119._16_4_ = uVar66;
        auVar119._20_4_ = uVar66;
        auVar119._24_4_ = uVar66;
        auVar119._28_4_ = uVar66;
        auVar111 = vcmpps_avx(auVar89,auVar119,2);
        local_820 = vandps_avx(auVar111,local_820);
        auVar90._8_4_ = 3;
        auVar90._0_8_ = 0x300000003;
        auVar90._12_4_ = 3;
        auVar90._16_4_ = 3;
        auVar90._20_4_ = 3;
        auVar90._24_4_ = 3;
        auVar90._28_4_ = 3;
        auVar120._8_4_ = 2;
        auVar120._0_8_ = 0x200000002;
        auVar120._12_4_ = 2;
        auVar120._16_4_ = 2;
        auVar120._20_4_ = 2;
        auVar120._24_4_ = 2;
        auVar120._28_4_ = 2;
        auVar111 = vblendvps_avx(auVar120,auVar90,local_5e0);
        _local_840 = vpcmpgtd_avx2(auVar111,local_600);
        local_860 = vpandn_avx2(_local_840,local_820);
        local_a40 = _local_460;
        local_800._4_4_ = (float)local_8c0._4_4_ + (float)local_460._4_4_;
        local_800._0_4_ = (float)local_8c0._0_4_ + (float)local_460._0_4_;
        fStack_7f8 = fStack_8b8 + fStack_458;
        fStack_7f4 = fStack_8b4 + fStack_454;
        fStack_7f0 = fStack_8b0 + fStack_450;
        fStack_7ec = fStack_8ac + fStack_44c;
        fStack_7e8 = fStack_8a8 + fStack_448;
        fStack_7e4 = fStack_8a4 + fStack_444;
        auVar210 = ZEXT3264(local_9e0);
        for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0x7f,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_860 >> 0xbf,0) != '\0') ||
               (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar111,local_860)) {
          auVar121._8_4_ = 0x7f800000;
          auVar121._0_8_ = 0x7f8000007f800000;
          auVar121._12_4_ = 0x7f800000;
          auVar121._16_4_ = 0x7f800000;
          auVar121._20_4_ = 0x7f800000;
          auVar121._24_4_ = 0x7f800000;
          auVar121._28_4_ = 0x7f800000;
          auVar111 = vblendvps_avx(auVar121,local_a40,local_860);
          auVar181 = vshufps_avx(auVar111,auVar111,0xb1);
          auVar181 = vminps_avx(auVar111,auVar181);
          auVar14 = vshufpd_avx(auVar181,auVar181,5);
          auVar181 = vminps_avx(auVar181,auVar14);
          auVar14 = vpermpd_avx2(auVar181,0x4e);
          auVar181 = vminps_avx(auVar181,auVar14);
          auVar181 = vcmpps_avx(auVar111,auVar181,0);
          auVar14 = local_860 & auVar181;
          auVar111 = local_860;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar181,local_860);
          }
          uVar61 = vmovmskps_avx(auVar111);
          iVar16 = 0;
          for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
            iVar16 = iVar16 + 1;
          }
          uVar65 = iVar16 << 2;
          *(undefined4 *)(local_860 + uVar65) = 0;
          uVar61 = *(uint *)(local_1c0 + uVar65);
          uVar65 = *(uint *)(local_440 + uVar65);
          fVar131 = auVar9._0_4_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar241 = ZEXT1664(auVar241._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar131 = sqrtf((float)local_980._0_4_);
            auVar261 = ZEXT3264(auVar257);
            auVar210 = ZEXT3264(local_9e0);
          }
          auVar81 = vminps_avx(auVar10,auVar12);
          auVar72 = vmaxps_avx(auVar10,auVar12);
          auVar97 = vminps_avx(auVar11,auVar73);
          auVar76 = vminps_avx(auVar81,auVar97);
          auVar81 = vmaxps_avx(auVar11,auVar73);
          auVar97 = vmaxps_avx(auVar72,auVar81);
          auVar72 = vandps_avx(auVar76,auVar227);
          auVar81 = vandps_avx(auVar97,auVar227);
          auVar72 = vmaxps_avx(auVar72,auVar81);
          auVar81 = vmovshdup_avx(auVar72);
          auVar81 = vmaxss_avx(auVar81,auVar72);
          auVar72 = vshufpd_avx(auVar72,auVar72,1);
          auVar72 = vmaxss_avx(auVar72,auVar81);
          local_9a0._0_4_ = auVar72._0_4_ * 1.9073486e-06;
          local_a00._0_4_ = fVar131 * 1.9073486e-06;
          local_7e0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
          auVar72 = vinsertps_avx(ZEXT416(uVar65),ZEXT416(uVar61),0x10);
          auVar236 = ZEXT1664(auVar72);
          lVar64 = 5;
          do {
            do {
              bVar68 = lVar64 == 0;
              lVar64 = lVar64 + -1;
              if (bVar68) goto LAB_01140d31;
              auVar76 = auVar236._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar76);
              fVar143 = 1.0 - local_a80._0_4_;
              auVar72 = vshufps_avx(auVar76,auVar76,0x55);
              fVar131 = auVar72._0_4_;
              auVar105._0_4_ = fVar93 * fVar131;
              fVar95 = auVar72._4_4_;
              auVar105._4_4_ = auVar12._4_4_ * fVar95;
              fVar142 = auVar72._8_4_;
              auVar105._8_4_ = auVar12._8_4_ * fVar142;
              fVar125 = auVar72._12_4_;
              auVar105._12_4_ = auVar12._12_4_ * fVar125;
              auVar134._4_4_ = fVar143;
              auVar134._0_4_ = fVar143;
              auVar134._8_4_ = fVar143;
              auVar134._12_4_ = fVar143;
              auVar72 = vfmadd231ps_fma(auVar105,auVar134,auVar10);
              auVar155._0_4_ = fVar94 * fVar131;
              auVar155._4_4_ = auVar11._4_4_ * fVar95;
              auVar155._8_4_ = auVar11._8_4_ * fVar142;
              auVar155._12_4_ = auVar11._12_4_ * fVar125;
              auVar81 = vfmadd231ps_fma(auVar155,auVar134,auVar12);
              auVar193._0_4_ = fVar131 * auVar81._0_4_;
              auVar193._4_4_ = fVar95 * auVar81._4_4_;
              auVar193._8_4_ = fVar142 * auVar81._8_4_;
              auVar193._12_4_ = fVar125 * auVar81._12_4_;
              auVar97 = vfmadd231ps_fma(auVar193,auVar134,auVar72);
              auVar106._0_4_ = fVar131 * fVar92;
              auVar106._4_4_ = fVar95 * fStack_b2c;
              auVar106._8_4_ = fVar142 * fStack_b28;
              auVar106._12_4_ = fVar125 * fStack_b24;
              auVar72 = vfmadd231ps_fma(auVar106,auVar134,auVar11);
              auVar178._0_4_ = fVar131 * auVar72._0_4_;
              auVar178._4_4_ = fVar95 * auVar72._4_4_;
              auVar178._8_4_ = fVar142 * auVar72._8_4_;
              auVar178._12_4_ = fVar125 * auVar72._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar178,auVar134,auVar81);
              uVar66 = auVar236._0_4_;
              auVar107._4_4_ = uVar66;
              auVar107._0_4_ = uVar66;
              auVar107._8_4_ = uVar66;
              auVar107._12_4_ = uVar66;
              auVar72 = vfmadd213ps_fma(auVar107,local_970,_DAT_01f45a50);
              auVar80._0_4_ = fVar131 * local_9c0._0_4_;
              auVar80._4_4_ = fVar95 * local_9c0._4_4_;
              auVar80._8_4_ = fVar142 * local_9c0._8_4_;
              auVar80._12_4_ = fVar125 * local_9c0._12_4_;
              auVar81 = vfmadd231ps_fma(auVar80,auVar97,auVar134);
              local_760._0_16_ = auVar81;
              auVar72 = vsubps_avx(auVar72,auVar81);
              _local_940 = auVar72;
              auVar72 = vdpps_avx(auVar72,auVar72,0x7f);
              fVar131 = auVar72._0_4_;
              if (fVar131 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar143);
                auVar248._0_4_ = sqrtf(fVar131);
                auVar248._4_60_ = extraout_var_00;
                auVar236 = ZEXT1664(auVar76);
                auVar81 = auVar248._0_16_;
                auVar98 = local_aa0._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar72,auVar72);
                auVar98 = ZEXT416((uint)fVar143);
              }
              auVar97 = vsubps_avx(local_9c0._0_16_,auVar97);
              auVar205._0_4_ = auVar97._0_4_ * 3.0;
              auVar205._4_4_ = auVar97._4_4_ * 3.0;
              auVar205._8_4_ = auVar97._8_4_ * 3.0;
              auVar205._12_4_ = auVar97._12_4_ * 3.0;
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,local_a80._0_16_);
              auVar147 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar98);
              fVar95 = auVar98._0_4_ * 6.0;
              fVar142 = auVar97._0_4_ * 6.0;
              fVar125 = auVar147._0_4_ * 6.0;
              fVar143 = local_a80._0_4_ * 6.0;
              auVar156._0_4_ = fVar143 * fVar92;
              auVar156._4_4_ = fVar143 * fStack_b2c;
              auVar156._8_4_ = fVar143 * fStack_b28;
              auVar156._12_4_ = fVar143 * fStack_b24;
              auVar108._4_4_ = fVar125;
              auVar108._0_4_ = fVar125;
              auVar108._8_4_ = fVar125;
              auVar108._12_4_ = fVar125;
              auVar97 = vfmadd132ps_fma(auVar108,auVar156,auVar11);
              auVar157._4_4_ = fVar142;
              auVar157._0_4_ = fVar142;
              auVar157._8_4_ = fVar142;
              auVar157._12_4_ = fVar142;
              auVar97 = vfmadd132ps_fma(auVar157,auVar97,auVar12);
              auVar98 = vdpps_avx(auVar205,auVar205,0x7f);
              auVar109._4_4_ = fVar95;
              auVar109._0_4_ = fVar95;
              auVar109._8_4_ = fVar95;
              auVar109._12_4_ = fVar95;
              auVar174 = vfmadd132ps_fma(auVar109,auVar97,auVar10);
              auVar97 = vblendps_avx(auVar98,_DAT_01f45a50,0xe);
              auVar147 = vrsqrtss_avx(auVar97,auVar97);
              fVar125 = auVar98._0_4_;
              fVar95 = auVar147._0_4_;
              auVar147 = vdpps_avx(auVar205,auVar174,0x7f);
              fVar95 = fVar95 * 1.5 + fVar125 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar110._0_4_ = auVar174._0_4_ * fVar125;
              auVar110._4_4_ = auVar174._4_4_ * fVar125;
              auVar110._8_4_ = auVar174._8_4_ * fVar125;
              auVar110._12_4_ = auVar174._12_4_ * fVar125;
              fVar142 = auVar147._0_4_;
              auVar194._0_4_ = auVar205._0_4_ * fVar142;
              auVar194._4_4_ = auVar205._4_4_ * fVar142;
              auVar194._8_4_ = auVar205._8_4_ * fVar142;
              auVar194._12_4_ = auVar205._12_4_ * fVar142;
              auVar147 = vsubps_avx(auVar110,auVar194);
              auVar97 = vrcpss_avx(auVar97,auVar97);
              auVar174 = vfnmadd213ss_fma(auVar97,auVar98,ZEXT416(0x40000000));
              fVar142 = auVar97._0_4_ * auVar174._0_4_;
              auVar97 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar236._0_4_ * (float)local_a00._0_4_)));
              auVar246 = ZEXT1664(auVar97);
              uVar1 = CONCAT44(auVar205._4_4_,auVar205._0_4_);
              local_9c0._0_8_ = uVar1 ^ 0x8000000080000000;
              local_9c0._8_4_ = -auVar205._8_4_;
              local_9c0._12_4_ = -auVar205._12_4_;
              auVar158._0_4_ = fVar95 * auVar147._0_4_ * fVar142;
              auVar158._4_4_ = fVar95 * auVar147._4_4_ * fVar142;
              auVar158._8_4_ = fVar95 * auVar147._8_4_ * fVar142;
              auVar158._12_4_ = fVar95 * auVar147._12_4_ * fVar142;
              auVar220._0_4_ = auVar205._0_4_ * fVar95;
              auVar220._4_4_ = auVar205._4_4_ * fVar95;
              auVar220._8_4_ = auVar205._8_4_ * fVar95;
              auVar220._12_4_ = auVar205._12_4_ * fVar95;
              local_a80._0_16_ = auVar205;
              local_aa0._0_4_ = auVar97._0_4_;
              if (fVar125 < -fVar125) {
                local_a20._0_16_ = auVar220;
                local_ac0._0_16_ = auVar158;
                fVar95 = sqrtf(fVar125);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar246 = ZEXT464((uint)local_aa0._0_4_);
                auVar158 = local_ac0._0_16_;
                auVar220 = local_a20._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar98,auVar98);
                fVar95 = auVar97._0_4_;
              }
              auVar97 = vdpps_avx(_local_940,auVar220,0x7f);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar81,auVar246._0_16_);
              auVar98 = vdpps_avx(local_9c0._0_16_,auVar220,0x7f);
              auVar147 = vdpps_avx(_local_940,auVar158,0x7f);
              auVar174 = vdpps_avx(local_970,auVar220,0x7f);
              auVar173 = vfmadd213ss_fma(ZEXT416((uint)(auVar81._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_9a0._0_4_ / fVar95)),auVar71);
              auVar82._0_4_ = auVar97._0_4_ * auVar97._0_4_;
              auVar82._4_4_ = auVar97._4_4_ * auVar97._4_4_;
              auVar82._8_4_ = auVar97._8_4_ * auVar97._8_4_;
              auVar82._12_4_ = auVar97._12_4_ * auVar97._12_4_;
              auVar81 = vdpps_avx(_local_940,local_9c0._0_16_,0x7f);
              auVar96 = vsubps_avx(auVar72,auVar82);
              auVar71 = vrsqrtss_avx(auVar96,auVar96);
              fVar142 = auVar96._0_4_;
              fVar95 = auVar71._0_4_;
              fVar95 = fVar95 * 1.5 + fVar142 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar71 = vdpps_avx(_local_940,local_970,0x7f);
              local_9c0._0_16_ = ZEXT416((uint)(auVar98._0_4_ + auVar147._0_4_));
              auVar81 = vfnmadd231ss_fma(auVar81,auVar97,local_9c0._0_16_);
              auVar98 = vfnmadd231ss_fma(auVar71,auVar97,auVar174);
              if (fVar142 < 0.0) {
                local_a20._0_16_ = auVar97;
                local_ac0._0_16_ = auVar174;
                local_780._0_16_ = auVar81;
                local_7a0._0_4_ = fVar95;
                local_7c0._0_16_ = auVar98;
                fVar142 = sqrtf(fVar142);
                auVar246 = ZEXT464((uint)local_aa0._0_4_);
                fVar95 = (float)local_7a0._0_4_;
                auVar98 = local_7c0._0_16_;
                auVar174 = local_ac0._0_16_;
                auVar81 = local_780._0_16_;
                auVar97 = local_a20._0_16_;
              }
              else {
                auVar147 = vsqrtss_avx(auVar96,auVar96);
                fVar142 = auVar147._0_4_;
              }
              auVar241 = ZEXT1664(auVar72);
              auVar210 = ZEXT3264(local_9e0);
              auVar261 = ZEXT3264(auVar257);
              auVar147 = vpermilps_avx(local_760._0_16_,0xff);
              fVar142 = fVar142 - auVar147._0_4_;
              auVar147 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar81 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar95),auVar147);
              auVar159._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
              auVar159._8_4_ = auVar174._8_4_ ^ 0x80000000;
              auVar159._12_4_ = auVar174._12_4_ ^ 0x80000000;
              auVar179._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
              auVar179._8_4_ = auVar81._8_4_ ^ 0x80000000;
              auVar179._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar71 = ZEXT416((uint)(auVar98._0_4_ * fVar95));
              auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar174._0_4_)),
                                        local_9c0._0_16_,auVar71);
              auVar81 = vinsertps_avx(auVar179,auVar71,0x1c);
              uVar66 = auVar98._0_4_;
              auVar180._4_4_ = uVar66;
              auVar180._0_4_ = uVar66;
              auVar180._8_4_ = uVar66;
              auVar180._12_4_ = uVar66;
              auVar81 = vdivps_avx(auVar81,auVar180);
              auVar98 = vinsertps_avx(local_9c0._0_16_,auVar159,0x10);
              auVar98 = vdivps_avx(auVar98,auVar180);
              fVar95 = auVar97._0_4_;
              auVar135._0_4_ = fVar95 * auVar81._0_4_ + fVar142 * auVar98._0_4_;
              auVar135._4_4_ = fVar95 * auVar81._4_4_ + fVar142 * auVar98._4_4_;
              auVar135._8_4_ = fVar95 * auVar81._8_4_ + fVar142 * auVar98._8_4_;
              auVar135._12_4_ = fVar95 * auVar81._12_4_ + fVar142 * auVar98._12_4_;
              auVar76 = vsubps_avx(auVar76,auVar135);
              auVar236 = ZEXT1664(auVar76);
              auVar81 = vandps_avx(auVar97,auVar227);
            } while (auVar173._0_4_ <= auVar81._0_4_);
            auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar246._0_4_ + auVar173._0_4_)),
                                      local_7e0._0_16_,ZEXT416(0x36000000));
            auVar81 = vandps_avx(ZEXT416((uint)fVar142),auVar227);
          } while (auVar97._0_4_ <= auVar81._0_4_);
          fVar95 = auVar76._0_4_ + (float)local_910._0_4_;
          auVar81 = ZEXT416((uint)fVar95);
          if (fVar69 <= fVar95) {
            fVar142 = *(float *)(ray + k * 4 + 0x80);
            auVar246 = ZEXT464((uint)fVar142);
            if (fVar95 <= fVar142) {
              auVar97 = vmovshdup_avx(auVar76);
              fVar125 = auVar97._0_4_;
              if ((0.0 <= fVar125) && (fVar125 <= 1.0)) {
                auVar97 = vrsqrtss_avx(auVar72,auVar72);
                fVar143 = auVar97._0_4_;
                pGVar5 = (context->scene->geometries).items[uVar67].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar131 = fVar143 * 1.5 + fVar131 * -0.5 * fVar143 * fVar143 * fVar143;
                  auVar160._0_4_ = fVar131 * (float)local_940._0_4_;
                  auVar160._4_4_ = fVar131 * (float)local_940._4_4_;
                  auVar160._8_4_ = fVar131 * fStack_938;
                  auVar160._12_4_ = fVar131 * fStack_934;
                  auVar174 = vfmadd213ps_fma(auVar147,auVar160,local_a80._0_16_);
                  auVar97 = vshufps_avx(auVar160,auVar160,0xc9);
                  auVar98 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                  auVar161._0_4_ = auVar160._0_4_ * auVar98._0_4_;
                  auVar161._4_4_ = auVar160._4_4_ * auVar98._4_4_;
                  auVar161._8_4_ = auVar160._8_4_ * auVar98._8_4_;
                  auVar161._12_4_ = auVar160._12_4_ * auVar98._12_4_;
                  auVar147 = vfmsub231ps_fma(auVar161,local_a80._0_16_,auVar97);
                  auVar97 = vshufps_avx(auVar147,auVar147,0xc9);
                  auVar98 = vshufps_avx(auVar174,auVar174,0xc9);
                  auVar147 = vshufps_avx(auVar147,auVar147,0xd2);
                  auVar83._0_4_ = auVar174._0_4_ * auVar147._0_4_;
                  auVar83._4_4_ = auVar174._4_4_ * auVar147._4_4_;
                  auVar83._8_4_ = auVar174._8_4_ * auVar147._8_4_;
                  auVar83._12_4_ = auVar174._12_4_ * auVar147._12_4_;
                  auVar97 = vfmsub231ps_fma(auVar83,auVar97,auVar98);
                  uVar66 = auVar97._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar95;
                    uVar4 = vextractps_avx(auVar97,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                    uVar4 = vextractps_avx(auVar97,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar66;
                    *(float *)(ray + k * 4 + 0xf0) = fVar125;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar67;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_6f0 = vshufps_avx(auVar76,auVar76,0x55);
                    auVar76 = vshufps_avx(auVar97,auVar97,0x55);
                    auStack_710 = vshufps_avx(auVar97,auVar97,0xaa);
                    local_720 = (RTCHitN  [16])auVar76;
                    local_700 = uVar66;
                    uStack_6fc = uVar66;
                    uStack_6f8 = uVar66;
                    uStack_6f4 = uVar66;
                    local_6e0 = ZEXT416(0) << 0x20;
                    local_6d0 = CONCAT44(uStack_73c,local_740);
                    uStack_6c8 = CONCAT44(uStack_734,uStack_738);
                    local_6c0._4_4_ = uStack_72c;
                    local_6c0._0_4_ = local_730;
                    local_6c0._8_4_ = uStack_728;
                    local_6c0._12_4_ = uStack_724;
                    vpcmpeqd_avx2(ZEXT1632(local_6c0),ZEXT1632(local_6c0));
                    uStack_6ac = context->user->instID[0];
                    local_6b0 = uStack_6ac;
                    uStack_6a8 = uStack_6ac;
                    uStack_6a4 = uStack_6ac;
                    uStack_6a0 = context->user->instPrimID[0];
                    uStack_69c = uStack_6a0;
                    uStack_698 = uStack_6a0;
                    uStack_694 = uStack_6a0;
                    *(float *)(ray + k * 4 + 0x80) = fVar95;
                    local_900 = *local_a48;
                    local_af0.valid = (int *)local_900;
                    local_af0.geometryUserPtr = pGVar5->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_720;
                    local_af0.N = 4;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar241 = ZEXT1664(auVar72);
                      (*pGVar5->intersectionFilterN)(&local_af0);
                      auVar261._8_56_ = extraout_var_02;
                      auVar261._0_8_ = extraout_XMM1_Qa_00;
                      auVar81 = auVar261._0_16_;
                      auVar210 = ZEXT3264(local_9e0);
                    }
                    if (local_900 == (undefined1  [16])0x0) {
                      auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar81 = vpcmpeqd_avx(auVar81,auVar81);
                      auVar72 = auVar72 ^ auVar81;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      auVar81 = vpcmpeqd_avx(auVar76,auVar76);
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar241 = ZEXT1664(auVar241._0_16_);
                        (*p_Var6)(&local_af0);
                        auVar210 = ZEXT3264(local_9e0);
                        auVar81 = vpcmpeqd_avx(auVar81,auVar81);
                      }
                      auVar97 = vpcmpeqd_avx(local_900,_DAT_01f45a50);
                      auVar72 = auVar97 ^ auVar81;
                      if (local_900 != (undefined1  [16])0x0) {
                        auVar97 = auVar97 ^ auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])local_af0.hit);
                        *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x10));
                        *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x20));
                        *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x30));
                        *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x40));
                        *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x50));
                        *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x60));
                        *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x70));
                        *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar81;
                        auVar81 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x80));
                        *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar81;
                      }
                    }
                    auVar246 = ZEXT464((uint)fVar142);
                    auVar261 = ZEXT3264(auVar257);
                    auVar84._8_8_ = 0x100000001;
                    auVar84._0_8_ = 0x100000001;
                    if ((auVar84 & auVar72) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar142;
                    }
                  }
                }
              }
            }
          }
LAB_01140d31:
          uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar235._4_4_ = uVar66;
          auVar235._0_4_ = uVar66;
          auVar235._8_4_ = uVar66;
          auVar235._12_4_ = uVar66;
          auVar235._16_4_ = uVar66;
          auVar235._20_4_ = uVar66;
          auVar235._24_4_ = uVar66;
          auVar235._28_4_ = uVar66;
          auVar236 = ZEXT3264(auVar235);
          auVar111 = vcmpps_avx(_local_800,auVar235,2);
        }
        auVar122._0_4_ = (float)local_8c0._0_4_ + local_4a0._0_4_;
        auVar122._4_4_ = (float)local_8c0._4_4_ + local_4a0._4_4_;
        auVar122._8_4_ = fStack_8b8 + local_4a0._8_4_;
        auVar122._12_4_ = fStack_8b4 + local_4a0._12_4_;
        auVar122._16_4_ = fStack_8b0 + local_4a0._16_4_;
        auVar122._20_4_ = fStack_8ac + local_4a0._20_4_;
        auVar122._24_4_ = fStack_8a8 + local_4a0._24_4_;
        auVar122._28_4_ = fStack_8a4 + local_4a0._28_4_;
        uVar66 = auVar236._0_4_;
        auVar171._4_4_ = uVar66;
        auVar171._0_4_ = uVar66;
        auVar171._8_4_ = uVar66;
        auVar171._12_4_ = uVar66;
        auVar171._16_4_ = uVar66;
        auVar171._20_4_ = uVar66;
        auVar171._24_4_ = uVar66;
        auVar171._28_4_ = uVar66;
        auVar181 = vcmpps_avx(auVar122,auVar171,2);
        auVar111 = vandps_avx(_local_5c0,local_5a0);
        auVar111 = vandps_avx(auVar181,auVar111);
        auVar185._0_4_ = (float)local_8c0._0_4_ + local_460._0_4_;
        auVar185._4_4_ = (float)local_8c0._4_4_ + local_460._4_4_;
        auVar185._8_4_ = fStack_8b8 + local_460._8_4_;
        auVar185._12_4_ = fStack_8b4 + local_460._12_4_;
        auVar185._16_4_ = fStack_8b0 + local_460._16_4_;
        auVar185._20_4_ = fStack_8ac + local_460._20_4_;
        auVar185._24_4_ = fStack_8a8 + local_460._24_4_;
        auVar185._28_4_ = fStack_8a4 + local_460._28_4_;
        auVar14 = vcmpps_avx(auVar185,auVar171,2);
        auVar181 = vandps_avx(_local_840,local_820);
        auVar181 = vandps_avx(auVar14,auVar181);
        auVar181 = vorps_avx(auVar111,auVar181);
        if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar181 >> 0x7f,0) != '\0') ||
              (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar181 >> 0xbf,0) != '\0') ||
            (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar181[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar63 * 0x60) = auVar181;
          auVar111 = vblendvps_avx(_local_460,local_4a0,auVar111);
          *(undefined1 (*) [32])(auStack_160 + uVar63 * 0x60) = auVar111;
          uVar1 = vmovlps_avx(local_550);
          (&uStack_140)[uVar63 * 0xc] = uVar1;
          aiStack_138[uVar63 * 0x18] = local_c44 + 1;
          uVar63 = (ulong)((int)uVar63 + 1);
        }
        auVar2._8_8_ = uStack_898;
        auVar2._0_8_ = local_8a0;
        auVar2._16_8_ = uStack_890;
        auVar2._24_8_ = uStack_888;
        fVar131 = (float)local_8c0._0_4_;
        fVar142 = (float)local_8c0._4_4_;
        fVar143 = fStack_8b8;
        fVar144 = fStack_8b4;
        fVar145 = fStack_8b0;
        fVar212 = fStack_8ac;
        fVar213 = fStack_8a8;
        fVar214 = fStack_8a4;
      }
      auVar236 = ZEXT3264(auVar2);
      auVar248 = ZEXT3264(local_960);
    }
    while( true ) {
      auVar181 = local_520;
      uVar61 = (uint)uVar63;
      if (uVar61 == 0) {
        uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar85._4_4_ = uVar66;
        auVar85._0_4_ = uVar66;
        auVar85._8_4_ = uVar66;
        auVar85._12_4_ = uVar66;
        auVar7 = vcmpps_avx(local_560,auVar85,2);
        uVar67 = vmovmskps_avx(auVar7);
        uVar62 = (ulong)(uVar67 & (uint)uVar62 - 1 & (uint)uVar62);
        goto LAB_0113e91e;
      }
      uVar63 = (ulong)(uVar61 - 1);
      lVar64 = uVar63 * 0x60;
      auVar111 = *(undefined1 (*) [32])(auStack_160 + lVar64);
      auVar86._0_4_ = fVar131 + auVar111._0_4_;
      auVar86._4_4_ = fVar142 + auVar111._4_4_;
      auVar86._8_4_ = fVar143 + auVar111._8_4_;
      auVar86._12_4_ = fVar144 + auVar111._12_4_;
      auVar86._16_4_ = fVar145 + auVar111._16_4_;
      auVar86._20_4_ = fVar212 + auVar111._20_4_;
      auVar86._24_4_ = fVar213 + auVar111._24_4_;
      auVar86._28_4_ = fVar214 + auVar111._28_4_;
      uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar166._4_4_ = uVar66;
      auVar166._0_4_ = uVar66;
      auVar166._8_4_ = uVar66;
      auVar166._12_4_ = uVar66;
      auVar166._16_4_ = uVar66;
      auVar166._20_4_ = uVar66;
      auVar166._24_4_ = uVar66;
      auVar166._28_4_ = uVar66;
      auVar14 = vcmpps_avx(auVar86,auVar166,2);
      auVar167 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar64));
      _local_720 = auVar167;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar64) & auVar14;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') break;
      uVar63 = (ulong)(uVar61 - 1);
    }
    auVar137._8_4_ = 0x7f800000;
    auVar137._0_8_ = 0x7f8000007f800000;
    auVar137._12_4_ = 0x7f800000;
    auVar137._16_4_ = 0x7f800000;
    auVar137._20_4_ = 0x7f800000;
    auVar137._24_4_ = 0x7f800000;
    auVar137._28_4_ = 0x7f800000;
    auVar111 = vblendvps_avx(auVar137,auVar111,auVar167);
    auVar14 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar14 = vminps_avx(auVar111,auVar14);
    auVar207 = vshufpd_avx(auVar14,auVar14,5);
    auVar14 = vminps_avx(auVar14,auVar207);
    auVar207 = vpermpd_avx2(auVar14,0x4e);
    auVar14 = vminps_avx(auVar14,auVar207);
    auVar111 = vcmpps_avx(auVar111,auVar14,0);
    auVar207 = auVar210._0_32_;
    auVar14 = auVar167 & auVar111;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar167 = vandps_avx(auVar111,auVar167);
    }
    auVar14._8_8_ = uStack_578;
    auVar14._0_8_ = local_580;
    auVar14._16_8_ = uStack_570;
    auVar14._24_8_ = uStack_568;
    uVar65 = vmovmskps_avx(auVar167);
    iVar16 = 0;
    for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
      iVar16 = iVar16 + 1;
    }
    *(undefined4 *)(local_720 + (uint)(iVar16 << 2)) = 0;
    uVar1 = (&uStack_140)[uVar63 * 0xc];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar1;
    local_c44 = aiStack_138[uVar63 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar64) = _local_720;
    uVar65 = uVar61 - 1;
    if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_720 >> 0x7f,0) != '\0') ||
          (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_720 >> 0xbf,0) != '\0') ||
        (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_720[0x1f] < '\0') {
      uVar65 = uVar61;
    }
    uVar66 = (undefined4)uVar1;
    auVar116._4_4_ = uVar66;
    auVar116._0_4_ = uVar66;
    auVar116._8_4_ = uVar66;
    auVar116._12_4_ = uVar66;
    auVar116._16_4_ = uVar66;
    auVar116._20_4_ = uVar66;
    auVar116._24_4_ = uVar66;
    auVar116._28_4_ = uVar66;
    auVar72 = vmovshdup_avx(auVar74);
    auVar72 = vsubps_avx(auVar72,auVar74);
    auVar87._0_4_ = auVar72._0_4_;
    auVar87._4_4_ = auVar87._0_4_;
    auVar87._8_4_ = auVar87._0_4_;
    auVar87._12_4_ = auVar87._0_4_;
    auVar87._16_4_ = auVar87._0_4_;
    auVar87._20_4_ = auVar87._0_4_;
    auVar87._24_4_ = auVar87._0_4_;
    auVar87._28_4_ = auVar87._0_4_;
    auVar72 = vfmadd132ps_fma(auVar87,auVar116,_DAT_01f7b040);
    local_4a0 = ZEXT1632(auVar72);
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar16 << 2));
    uVar63 = (ulong)uVar65;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }